

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O1

void idct64_low32_ssse3(__m128i *input,__m128i *output)

{
  undefined4 uVar1;
  __m128i _in0_3;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  __m128i _in1_2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  __m128i _in1_8;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  __m128i _in1_7;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  __m128i _in1_4;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  __m128i _in1_5;
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  __m128i alVar330;
  __m128i _in1_1;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar352 [16];
  __m128i _in1_6;
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  __m128i _in1_11;
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar401 [16];
  __m128i _in1_3;
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar486 [16];
  __m128i _in1;
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar511 [16];
  __m128i _in1_9;
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined2 local_498;
  undefined2 uStack_496;
  undefined2 uStack_494;
  undefined2 uStack_492;
  undefined2 uStack_490;
  undefined2 uStack_48e;
  undefined2 uStack_48c;
  undefined2 uStack_48a;
  undefined2 local_478;
  undefined2 uStack_476;
  undefined2 uStack_474;
  undefined2 uStack_472;
  undefined2 uStack_470;
  undefined2 uStack_46e;
  undefined2 uStack_46c;
  undefined2 uStack_46a;
  undefined2 local_468;
  undefined2 uStack_466;
  undefined2 uStack_464;
  undefined2 uStack_462;
  undefined2 uStack_460;
  undefined2 uStack_45e;
  undefined2 uStack_45c;
  undefined2 uStack_45a;
  undefined2 local_448;
  undefined2 uStack_446;
  undefined2 uStack_444;
  undefined2 uStack_442;
  undefined2 uStack_440;
  undefined2 uStack_43e;
  undefined2 uStack_43c;
  undefined2 uStack_43a;
  undefined2 local_428;
  undefined2 uStack_426;
  undefined2 uStack_424;
  undefined2 uStack_422;
  undefined2 uStack_420;
  undefined2 uStack_41e;
  undefined2 uStack_41c;
  undefined2 uStack_41a;
  undefined2 local_408;
  undefined2 uStack_406;
  undefined2 uStack_404;
  undefined2 uStack_402;
  undefined2 uStack_400;
  undefined2 uStack_3fe;
  undefined2 uStack_3fc;
  undefined2 uStack_3fa;
  undefined2 local_3f8;
  undefined2 uStack_3f6;
  undefined2 uStack_3f4;
  undefined2 uStack_3f2;
  undefined2 uStack_3f0;
  undefined2 uStack_3ee;
  undefined2 uStack_3ec;
  undefined2 uStack_3ea;
  undefined2 local_3e8;
  undefined2 uStack_3e6;
  undefined2 uStack_3e4;
  undefined2 uStack_3e2;
  undefined2 uStack_3e0;
  undefined2 uStack_3de;
  undefined2 uStack_3dc;
  undefined2 uStack_3da;
  undefined2 local_3c8;
  undefined2 uStack_3c6;
  undefined2 uStack_3c4;
  undefined2 uStack_3c2;
  undefined2 uStack_3c0;
  undefined2 uStack_3be;
  undefined2 uStack_3bc;
  undefined2 uStack_3ba;
  undefined2 local_3a8;
  undefined2 uStack_3a6;
  undefined2 uStack_3a4;
  undefined2 uStack_3a2;
  undefined2 uStack_3a0;
  undefined2 uStack_39e;
  undefined2 uStack_39c;
  undefined2 uStack_39a;
  undefined2 local_388;
  undefined2 uStack_386;
  undefined2 uStack_384;
  undefined2 uStack_382;
  undefined2 uStack_380;
  undefined2 uStack_37e;
  undefined2 uStack_37c;
  undefined2 uStack_37a;
  undefined2 local_378;
  undefined2 uStack_376;
  undefined2 uStack_374;
  undefined2 uStack_372;
  undefined2 uStack_370;
  undefined2 uStack_36e;
  undefined2 uStack_36c;
  undefined2 uStack_36a;
  undefined2 local_358;
  undefined2 uStack_356;
  undefined2 uStack_354;
  undefined2 uStack_352;
  undefined2 uStack_350;
  undefined2 uStack_34e;
  undefined2 uStack_34c;
  undefined2 uStack_34a;
  undefined2 local_348;
  undefined2 uStack_346;
  undefined2 uStack_344;
  undefined2 uStack_342;
  undefined2 uStack_340;
  undefined2 uStack_33e;
  undefined2 uStack_33c;
  undefined2 uStack_33a;
  undefined2 local_2d8;
  undefined2 uStack_2d6;
  undefined2 uStack_2d4;
  undefined2 uStack_2d2;
  undefined2 uStack_2d0;
  undefined2 uStack_2ce;
  undefined2 uStack_2cc;
  undefined2 uStack_2ca;
  undefined2 local_2c8;
  undefined2 uStack_2c6;
  undefined2 uStack_2c4;
  undefined2 uStack_2c2;
  undefined2 uStack_2c0;
  undefined2 uStack_2be;
  undefined2 uStack_2bc;
  undefined2 uStack_2ba;
  undefined2 local_2a8;
  undefined2 uStack_2a6;
  undefined2 uStack_2a4;
  undefined2 uStack_2a2;
  undefined2 uStack_2a0;
  undefined2 uStack_29e;
  undefined2 uStack_29c;
  undefined2 uStack_29a;
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 uStack_200;
  undefined2 uStack_1fe;
  undefined2 uStack_1fc;
  undefined2 uStack_1fa;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 uStack_1e0;
  undefined2 uStack_1de;
  undefined2 uStack_1dc;
  undefined2 uStack_1da;
  undefined2 local_1d8;
  undefined2 uStack_1d6;
  undefined2 uStack_1d4;
  undefined2 uStack_1d2;
  undefined2 uStack_1d0;
  undefined2 uStack_1ce;
  undefined2 uStack_1cc;
  undefined2 uStack_1ca;
  undefined2 local_1c8;
  undefined2 uStack_1c6;
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined2 uStack_1c0;
  undefined2 uStack_1be;
  undefined2 uStack_1bc;
  undefined2 uStack_1ba;
  undefined2 local_1b8;
  undefined2 uStack_1b6;
  undefined2 uStack_1b4;
  undefined2 uStack_1b2;
  undefined2 uStack_1b0;
  undefined2 uStack_1ae;
  undefined2 uStack_1ac;
  undefined2 uStack_1aa;
  undefined2 local_1a8;
  undefined2 uStack_1a6;
  undefined2 uStack_1a4;
  undefined2 uStack_1a2;
  undefined2 uStack_1a0;
  undefined2 uStack_19e;
  undefined2 uStack_19c;
  undefined2 uStack_19a;
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined2 uStack_180;
  undefined2 uStack_17e;
  undefined2 uStack_17c;
  undefined2 uStack_17a;
  undefined2 local_178;
  undefined2 uStack_176;
  undefined2 uStack_174;
  undefined2 uStack_172;
  undefined2 uStack_170;
  undefined2 uStack_16e;
  undefined2 uStack_16c;
  undefined2 uStack_16a;
  undefined2 local_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 local_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 local_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 uStack_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined2 uStack_40;
  undefined2 uStack_3e;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  undefined1 auVar13 [16];
  undefined1 auVar25 [16];
  undefined1 auVar38 [16];
  undefined1 auVar54 [16];
  undefined1 auVar65 [16];
  undefined1 auVar70 [16];
  undefined1 auVar75 [16];
  undefined1 auVar93 [16];
  undefined1 auVar14 [16];
  undefined1 auVar26 [16];
  undefined1 auVar39 [16];
  undefined1 auVar55 [16];
  undefined1 auVar66 [16];
  undefined1 auVar71 [16];
  undefined1 auVar76 [16];
  undefined1 auVar94 [16];
  undefined1 auVar15 [16];
  undefined1 auVar27 [16];
  undefined1 auVar40 [16];
  undefined1 auVar56 [16];
  undefined1 auVar67 [16];
  undefined1 auVar72 [16];
  undefined1 auVar77 [16];
  undefined1 auVar95 [16];
  undefined1 auVar137 [16];
  undefined1 auVar152 [16];
  undefined1 auVar157 [16];
  undefined1 auVar138 [16];
  undefined1 auVar153 [16];
  undefined1 auVar158 [16];
  undefined1 auVar139 [16];
  undefined1 auVar154 [16];
  undefined1 auVar159 [16];
  undefined1 auVar200 [16];
  undefined1 auVar206 [16];
  undefined1 auVar211 [16];
  undefined1 auVar217 [16];
  undefined1 auVar225 [16];
  undefined1 auVar230 [16];
  undefined1 auVar235 [16];
  undefined1 auVar201 [16];
  undefined1 auVar207 [16];
  undefined1 auVar212 [16];
  undefined1 auVar218 [16];
  undefined1 auVar226 [16];
  undefined1 auVar231 [16];
  undefined1 auVar236 [16];
  undefined1 auVar202 [16];
  undefined1 auVar208 [16];
  undefined1 auVar213 [16];
  undefined1 auVar219 [16];
  undefined1 auVar227 [16];
  undefined1 auVar232 [16];
  undefined1 auVar237 [16];
  undefined1 auVar255 [16];
  undefined1 auVar260 [16];
  undefined1 auVar266 [16];
  undefined1 auVar273 [16];
  undefined1 auVar278 [16];
  undefined1 auVar256 [16];
  undefined1 auVar261 [16];
  undefined1 auVar267 [16];
  undefined1 auVar274 [16];
  undefined1 auVar279 [16];
  undefined1 auVar257 [16];
  undefined1 auVar262 [16];
  undefined1 auVar268 [16];
  undefined1 auVar275 [16];
  undefined1 auVar280 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar362 [16];
  undefined1 auVar367 [16];
  undefined1 auVar363 [16];
  undefined1 auVar368 [16];
  undefined1 auVar364 [16];
  undefined1 auVar369 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar414 [16];
  undefined1 auVar419 [16];
  undefined1 auVar424 [16];
  undefined1 auVar415 [16];
  undefined1 auVar420 [16];
  undefined1 auVar425 [16];
  undefined1 auVar416 [16];
  undefined1 auVar421 [16];
  undefined1 auVar426 [16];
  undefined1 auVar435 [16];
  undefined1 auVar446 [16];
  undefined1 auVar452 [16];
  undefined1 auVar436 [16];
  undefined1 auVar447 [16];
  undefined1 auVar453 [16];
  undefined1 auVar437 [16];
  undefined1 auVar448 [16];
  undefined1 auVar454 [16];
  undefined1 auVar462 [16];
  undefined1 auVar468 [16];
  undefined1 auVar478 [16];
  undefined1 auVar483 [16];
  undefined1 auVar463 [16];
  undefined1 auVar469 [16];
  undefined1 auVar479 [16];
  undefined1 auVar484 [16];
  undefined1 auVar464 [16];
  undefined1 auVar470 [16];
  undefined1 auVar480 [16];
  undefined1 auVar485 [16];
  undefined1 auVar493 [16];
  undefined1 auVar499 [16];
  undefined1 auVar508 [16];
  undefined1 auVar494 [16];
  undefined1 auVar500 [16];
  undefined1 auVar509 [16];
  undefined1 auVar495 [16];
  undefined1 auVar501 [16];
  undefined1 auVar510 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  
  auVar242 = pshuflw(ZEXT416(0x328),ZEXT416(0x328),0);
  uVar1 = auVar242._0_4_;
  auVar371._4_4_ = uVar1;
  auVar371._0_4_ = uVar1;
  auVar371._8_4_ = uVar1;
  auVar371._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7ff8),ZEXT416(0x7ff8),0);
  uVar1 = auVar242._0_4_;
  auVar243._4_4_ = uVar1;
  auVar243._0_4_ = uVar1;
  auVar243._8_4_ = uVar1;
  auVar243._12_4_ = uVar1;
  auVar372 = pmulhrsw(auVar371,(undefined1  [16])input[1]);
  auVar244 = pmulhrsw(auVar243,(undefined1  [16])input[1]);
  auVar242 = pshuflw(ZEXT416(0xffffa7c0),ZEXT416(0xffffa7c0),0);
  uVar1 = auVar242._0_4_;
  auVar487._4_4_ = uVar1;
  auVar487._0_4_ = uVar1;
  auVar487._8_4_ = uVar1;
  auVar487._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x5cb8),ZEXT416(0x5cb8),0);
  uVar1 = auVar242._0_4_;
  auVar245._4_4_ = uVar1;
  auVar245._0_4_ = uVar1;
  auVar245._8_4_ = uVar1;
  auVar245._12_4_ = uVar1;
  auVar488 = pmulhrsw(auVar487,(undefined1  [16])input[0x1f]);
  auVar246 = pmulhrsw(auVar245,(undefined1  [16])input[0x1f]);
  auVar242 = pshuflw(ZEXT416(0x33e0),ZEXT416(0x33e0),0);
  uVar1 = auVar242._0_4_;
  auVar331._4_4_ = uVar1;
  auVar331._0_4_ = uVar1;
  auVar331._8_4_ = uVar1;
  auVar331._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7508),ZEXT416(0x7508),0);
  uVar1 = auVar242._0_4_;
  auVar247._4_4_ = uVar1;
  auVar247._0_4_ = uVar1;
  auVar247._8_4_ = uVar1;
  auVar247._12_4_ = uVar1;
  auVar332 = pmulhrsw(auVar331,(undefined1  [16])input[0x11]);
  auVar248 = pmulhrsw(auVar247,(undefined1  [16])input[0x11]);
  auVar242 = pshuflw(ZEXT416(0xffffd1f0),ZEXT416(0xffffd1f0),0);
  uVar1 = auVar242._0_4_;
  auVar311._4_4_ = uVar1;
  auVar311._0_4_ = uVar1;
  auVar311._8_4_ = uVar1;
  auVar311._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7770),ZEXT416(0x7770),0);
  uVar1 = auVar242._0_4_;
  auVar249._4_4_ = uVar1;
  auVar249._0_4_ = uVar1;
  auVar249._8_4_ = uVar1;
  auVar249._12_4_ = uVar1;
  auVar312 = pmulhrsw(auVar311,(undefined1  [16])input[0xf]);
  auVar250 = pmulhrsw(auVar249,(undefined1  [16])input[0xf]);
  auVar242 = pshuflw(ZEXT416(0x1c08),ZEXT416(0x1c08),0);
  uVar1 = auVar242._0_4_;
  auVar512._4_4_ = uVar1;
  auVar512._0_4_ = uVar1;
  auVar512._8_4_ = uVar1;
  auVar512._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7ce0),ZEXT416(0x7ce0),0);
  auVar176._0_4_ = auVar242._0_4_;
  auVar176._4_4_ = auVar176._0_4_;
  auVar176._8_4_ = auVar176._0_4_;
  auVar176._12_4_ = auVar176._0_4_;
  auVar513 = pmulhrsw(auVar512,(undefined1  [16])input[9]);
  auVar177 = pmulhrsw(auVar176,(undefined1  [16])input[9]);
  auVar242 = pshuflw(ZEXT416(0xffffbb88),ZEXT416(0xffffbb88),0);
  uVar1 = auVar242._0_4_;
  auVar333._4_4_ = uVar1;
  auVar333._0_4_ = uVar1;
  auVar333._8_4_ = uVar1;
  auVar333._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x6c28),ZEXT416(0x6c28),0);
  auVar106._0_4_ = auVar242._0_4_;
  auVar106._4_4_ = auVar106._0_4_;
  auVar106._8_4_ = auVar106._0_4_;
  auVar106._12_4_ = auVar106._0_4_;
  auVar334 = pmulhrsw(auVar333,(undefined1  [16])input[0x17]);
  auVar96 = pmulhrsw(auVar106,(undefined1  [16])input[0x17]);
  auVar242 = pshuflw(ZEXT416(0x49b8),ZEXT416(0x49b8),0);
  uVar1 = auVar242._0_4_;
  auVar108._4_4_ = uVar1;
  auVar108._0_4_ = uVar1;
  auVar108._8_4_ = uVar1;
  auVar108._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x68a8),ZEXT416(0x68a8),0);
  auVar2._0_4_ = auVar242._0_4_;
  auVar2._4_4_ = auVar2._0_4_;
  auVar2._8_4_ = auVar2._0_4_;
  auVar2._12_4_ = auVar2._0_4_;
  auVar97 = pmulhrsw(auVar108,(undefined1  [16])input[0x19]);
  auVar4 = pmulhrsw(auVar2,(undefined1  [16])input[0x19]);
  auVar242 = pshuflw(ZEXT416(0xffffea20),ZEXT416(0xffffea20),0);
  uVar1 = auVar242._0_4_;
  auVar6._4_4_ = uVar1;
  auVar6._0_4_ = uVar1;
  auVar6._8_4_ = uVar1;
  auVar6._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7e20),ZEXT416(0x7e20),0);
  uVar1 = auVar242._0_4_;
  auVar3._4_4_ = uVar1;
  auVar3._0_4_ = uVar1;
  auVar3._8_4_ = uVar1;
  auVar3._12_4_ = uVar1;
  auVar98 = pmulhrsw(auVar6,(undefined1  [16])input[7]);
  auVar5 = pmulhrsw(auVar3,(undefined1  [16])input[7]);
  auVar242 = pshuflw(ZEXT416(0xfa8),ZEXT416(0xfa8),0);
  uVar1 = auVar242._0_4_;
  auVar456._4_4_ = uVar1;
  auVar456._0_4_ = uVar1;
  auVar456._8_4_ = uVar1;
  auVar456._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7f08),ZEXT416(0x7f08),0);
  uVar1 = auVar242._0_4_;
  auVar110._4_4_ = uVar1;
  auVar110._0_4_ = uVar1;
  auVar110._8_4_ = uVar1;
  auVar110._12_4_ = uVar1;
  auVar457 = pmulhrsw(auVar456,(undefined1  [16])input[5]);
  auVar6 = pmulhrsw(auVar110,(undefined1  [16])input[5]);
  auVar242 = pshuflw(ZEXT416(0xffffb140),ZEXT416(0xffffb140),0);
  uVar1 = auVar242._0_4_;
  auVar179._4_4_ = uVar1;
  auVar179._0_4_ = uVar1;
  auVar179._8_4_ = uVar1;
  auVar179._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x64e8),ZEXT416(0x64e8),0);
  uVar1 = auVar242._0_4_;
  auVar99._4_4_ = uVar1;
  auVar99._0_4_ = uVar1;
  auVar99._8_4_ = uVar1;
  auVar99._12_4_ = uVar1;
  auVar7 = pmulhrsw(auVar179,(undefined1  [16])input[0x1b]);
  auVar100 = pmulhrsw(auVar99,(undefined1  [16])input[0x1b]);
  auVar242 = pshuflw(ZEXT416(0x3f18),ZEXT416(0x3f18),0);
  uVar1 = auVar242._0_4_;
  auVar178._4_4_ = uVar1;
  auVar178._0_4_ = uVar1;
  auVar178._8_4_ = uVar1;
  auVar178._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x6f60),ZEXT416(0x6f60),0);
  uVar1 = auVar242._0_4_;
  auVar101._4_4_ = uVar1;
  auVar101._0_4_ = uVar1;
  auVar101._8_4_ = uVar1;
  auVar101._12_4_ = uVar1;
  auVar179 = pmulhrsw(auVar178,(undefined1  [16])input[0x15]);
  auVar102 = pmulhrsw(auVar101,(undefined1  [16])input[0x15]);
  auVar242 = pshuflw(ZEXT416(0xffffdde0),ZEXT416(0xffffdde0),0);
  uVar1 = auVar242._0_4_;
  auVar180._4_4_ = uVar1;
  auVar180._0_4_ = uVar1;
  auVar180._8_4_ = uVar1;
  auVar180._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7b60),ZEXT416(0x7b60),0);
  uVar1 = auVar242._0_4_;
  auVar103._4_4_ = uVar1;
  auVar103._0_4_ = uVar1;
  auVar103._8_4_ = uVar1;
  auVar103._12_4_ = uVar1;
  auVar181 = pmulhrsw(auVar180,(undefined1  [16])input[0xb]);
  auVar104 = pmulhrsw(auVar103,(undefined1  [16])input[0xb]);
  auVar242 = pshuflw(ZEXT416(0x2828),ZEXT416(0x2828),0);
  uVar1 = auVar242._0_4_;
  auVar182._4_4_ = uVar1;
  auVar182._0_4_ = uVar1;
  auVar182._8_4_ = uVar1;
  auVar182._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7988),ZEXT416(0x7988),0);
  uVar1 = auVar242._0_4_;
  auVar105._4_4_ = uVar1;
  auVar105._0_4_ = uVar1;
  auVar105._8_4_ = uVar1;
  auVar105._12_4_ = uVar1;
  auVar183 = pmulhrsw(auVar182,(undefined1  [16])input[0xd]);
  auVar106 = pmulhrsw(auVar105,(undefined1  [16])input[0xd]);
  auVar242 = pshuflw(ZEXT416(0xffffc670),ZEXT416(0xffffc670),0);
  uVar1 = auVar242._0_4_;
  auVar402._4_4_ = uVar1;
  auVar402._0_4_ = uVar1;
  auVar402._8_4_ = uVar1;
  auVar402._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7258),ZEXT416(0x7258),0);
  uVar1 = auVar242._0_4_;
  auVar107._4_4_ = uVar1;
  auVar107._0_4_ = uVar1;
  auVar107._8_4_ = uVar1;
  auVar107._12_4_ = uVar1;
  auVar403 = pmulhrsw(auVar402,(undefined1  [16])input[0x13]);
  auVar108 = pmulhrsw(auVar107,(undefined1  [16])input[0x13]);
  auVar242 = pshuflw(ZEXT416(0x5398),ZEXT416(0x5398),0);
  uVar1 = auVar242._0_4_;
  auVar251._4_4_ = uVar1;
  auVar251._0_4_ = uVar1;
  auVar251._8_4_ = uVar1;
  auVar251._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x60f0),ZEXT416(0x60f0),0);
  uVar1 = auVar242._0_4_;
  auVar313._4_4_ = uVar1;
  auVar313._0_4_ = uVar1;
  auVar313._8_4_ = uVar1;
  auVar313._12_4_ = uVar1;
  auVar252 = pmulhrsw(auVar251,(undefined1  [16])input[0x1d]);
  auVar314 = pmulhrsw(auVar313,(undefined1  [16])input[0x1d]);
  auVar242 = pshuflw(ZEXT416(0xfffff698),ZEXT416(0xfffff698),0);
  uVar1 = auVar242._0_4_;
  auVar109._4_4_ = uVar1;
  auVar109._0_4_ = uVar1;
  auVar109._8_4_ = uVar1;
  auVar109._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7fa8),ZEXT416(0x7fa8),0);
  uVar1 = auVar242._0_4_;
  auVar184._4_4_ = uVar1;
  auVar184._0_4_ = uVar1;
  auVar184._8_4_ = uVar1;
  auVar184._12_4_ = uVar1;
  auVar110 = pmulhrsw(auVar109,(undefined1  [16])input[3]);
  auVar185 = pmulhrsw(auVar184,(undefined1  [16])input[3]);
  auVar242 = pshuflw(ZEXT416(0x648),ZEXT416(0x648),0);
  uVar1 = auVar242._0_4_;
  auVar186._4_4_ = uVar1;
  auVar186._0_4_ = uVar1;
  auVar186._8_4_ = uVar1;
  auVar186._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7fd8),ZEXT416(0x7fd8),0);
  uVar1 = auVar242._0_4_;
  auVar111._4_4_ = uVar1;
  auVar111._0_4_ = uVar1;
  auVar111._8_4_ = uVar1;
  auVar111._12_4_ = uVar1;
  auVar187 = pmulhrsw(auVar186,(undefined1  [16])input[2]);
  auVar112 = pmulhrsw(auVar111,(undefined1  [16])input[2]);
  auVar242 = pshuflw(ZEXT416(0xffffaa08),ZEXT416(0xffffaa08),0);
  uVar1 = auVar242._0_4_;
  auVar188._4_4_ = uVar1;
  auVar188._0_4_ = uVar1;
  auVar188._8_4_ = uVar1;
  auVar188._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x5ed8),ZEXT416(0x5ed8),0);
  uVar1 = auVar242._0_4_;
  auVar113._4_4_ = uVar1;
  auVar113._0_4_ = uVar1;
  auVar113._8_4_ = uVar1;
  auVar113._12_4_ = uVar1;
  auVar189 = pmulhrsw(auVar188,(undefined1  [16])input[0x1e]);
  auVar114 = pmulhrsw(auVar113,(undefined1  [16])input[0x1e]);
  auVar242 = pshuflw(ZEXT416(0x36b8),ZEXT416(0x36b8),0);
  uVar1 = auVar242._0_4_;
  auVar190._4_4_ = uVar1;
  auVar190._0_4_ = uVar1;
  auVar190._8_4_ = uVar1;
  auVar190._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x73b8),ZEXT416(0x73b8),0);
  uVar1 = auVar242._0_4_;
  auVar115._4_4_ = uVar1;
  auVar115._0_4_ = uVar1;
  auVar115._8_4_ = uVar1;
  auVar115._12_4_ = uVar1;
  auVar191 = pmulhrsw(auVar190,(undefined1  [16])input[0x12]);
  auVar116 = pmulhrsw(auVar115,(undefined1  [16])input[0x12]);
  auVar242 = pshuflw(ZEXT416(0xffffd4e0),ZEXT416(0xffffd4e0),0);
  uVar1 = auVar242._0_4_;
  auVar192._4_4_ = uVar1;
  auVar192._0_4_ = uVar1;
  auVar192._8_4_ = uVar1;
  auVar192._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7888),ZEXT416(0x7888),0);
  uVar1 = auVar242._0_4_;
  auVar117._4_4_ = uVar1;
  auVar117._0_4_ = uVar1;
  auVar117._8_4_ = uVar1;
  auVar117._12_4_ = uVar1;
  auVar193 = pmulhrsw(auVar192,(undefined1  [16])input[0xe]);
  auVar118 = pmulhrsw(auVar117,(undefined1  [16])input[0xe]);
  auVar242 = pshuflw(ZEXT416(0x1f18),ZEXT416(0x1f18),0);
  uVar1 = auVar242._0_4_;
  auVar194._4_4_ = uVar1;
  auVar194._0_4_ = uVar1;
  auVar194._8_4_ = uVar1;
  auVar194._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7c28),ZEXT416(0x7c28),0);
  uVar1 = auVar242._0_4_;
  auVar119._4_4_ = uVar1;
  auVar119._0_4_ = uVar1;
  auVar119._8_4_ = uVar1;
  auVar119._12_4_ = uVar1;
  auVar195 = pmulhrsw(auVar194,(undefined1  [16])input[10]);
  auVar120 = pmulhrsw(auVar119,(undefined1  [16])input[10]);
  auVar242 = pshuflw(ZEXT416(0xffffbe30),ZEXT416(0xffffbe30),0);
  uVar1 = auVar242._0_4_;
  auVar353._4_4_ = uVar1;
  auVar353._0_4_ = uVar1;
  auVar353._8_4_ = uVar1;
  auVar353._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x6dc8),ZEXT416(0x6dc8),0);
  uVar1 = auVar242._0_4_;
  auVar121._4_4_ = uVar1;
  auVar121._0_4_ = uVar1;
  auVar121._8_4_ = uVar1;
  auVar121._12_4_ = uVar1;
  auVar354 = pmulhrsw(auVar353,(undefined1  [16])input[0x16]);
  auVar122 = pmulhrsw(auVar121,(undefined1  [16])input[0x16]);
  auVar242 = pshuflw(ZEXT416(0x4c40),ZEXT416(0x4c40),0);
  uVar1 = auVar242._0_4_;
  auVar196._4_4_ = uVar1;
  auVar196._0_4_ = uVar1;
  auVar196._8_4_ = uVar1;
  auVar196._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x66d0),ZEXT416(0x66d0),0);
  uVar1 = auVar242._0_4_;
  auVar123._4_4_ = uVar1;
  auVar123._0_4_ = uVar1;
  auVar123._8_4_ = uVar1;
  auVar123._12_4_ = uVar1;
  auVar197 = pmulhrsw(auVar196,(undefined1  [16])input[0x1a]);
  auVar124 = pmulhrsw(auVar123,(undefined1  [16])input[0x1a]);
  auVar242 = pshuflw(ZEXT416(0xffffed38),ZEXT416(0xffffed38),0);
  uVar1 = auVar242._0_4_;
  auVar429._4_4_ = uVar1;
  auVar429._0_4_ = uVar1;
  auVar429._8_4_ = uVar1;
  auVar429._12_4_ = uVar1;
  auVar242 = pshuflw(ZEXT416(0x7ea0),ZEXT416(0x7ea0),0);
  uVar1 = auVar242._0_4_;
  auVar386._4_4_ = uVar1;
  auVar386._0_4_ = uVar1;
  auVar386._8_4_ = uVar1;
  auVar386._12_4_ = uVar1;
  auVar430 = pmulhrsw(auVar429,(undefined1  [16])input[6]);
  auVar387 = pmulhrsw(auVar386,(undefined1  [16])input[6]);
  auVar242 = paddsw(auVar372,auVar488);
  auVar373 = psubsw(auVar372,auVar488);
  auVar489 = psubsw(auVar312,auVar332);
  auVar2 = paddsw(auVar312,auVar332);
  auVar312 = paddsw(auVar513,auVar334);
  auVar514 = psubsw(auVar513,auVar334);
  auVar335 = psubsw(auVar98,auVar97);
  auVar97 = paddsw(auVar98,auVar97);
  auVar3 = paddsw(auVar457,auVar7);
  auVar458 = psubsw(auVar457,auVar7);
  auVar288 = psubsw(auVar181,auVar179);
  auVar7 = paddsw(auVar181,auVar179);
  auVar98 = paddsw(auVar183,auVar403);
  auVar332 = psubsw(auVar183,auVar403);
  auVar404 = psubsw(auVar110,auVar252);
  auVar110 = paddsw(auVar110,auVar252);
  auVar179 = paddsw(auVar185,auVar314);
  auVar334 = psubsw(auVar185,auVar314);
  auVar314 = psubsw(auVar106,auVar108);
  auVar106 = paddsw(auVar108,auVar106);
  auVar108 = paddsw(auVar104,auVar102);
  auVar372 = psubsw(auVar104,auVar102);
  auVar252 = psubsw(auVar6,auVar100);
  auVar6 = paddsw(auVar100,auVar6);
  auVar100 = paddsw(auVar5,auVar4);
  auVar403 = psubsw(auVar5,auVar4);
  auVar457 = psubsw(auVar177,auVar96);
  auVar4 = paddsw(auVar96,auVar177);
  auVar5 = paddsw(auVar250,auVar248);
  auVar488 = psubsw(auVar250,auVar248);
  auVar513 = psubsw(auVar244,auVar246);
  auVar315 = paddsw(auVar246,auVar244);
  auVar96 = pshuflw(ZEXT416(0xc88),ZEXT416(0xc88),0);
  uVar1 = auVar96._0_4_;
  auVar474._4_4_ = uVar1;
  auVar474._0_4_ = uVar1;
  auVar474._8_4_ = uVar1;
  auVar474._12_4_ = uVar1;
  auVar96 = pshuflw(ZEXT416(0x7f60),ZEXT416(0x7f60),0);
  uVar1 = auVar96._0_4_;
  auVar96._4_4_ = uVar1;
  auVar96._0_4_ = uVar1;
  auVar96._8_4_ = uVar1;
  auVar96._12_4_ = uVar1;
  auVar244 = pmulhrsw(auVar474,(undefined1  [16])input[4]);
  auVar96 = pmulhrsw(auVar96,(undefined1  [16])input[4]);
  auVar102 = pshuflw(ZEXT416(0xffffaed0),ZEXT416(0xffffaed0),0);
  uVar1 = auVar102._0_4_;
  auVar503._4_4_ = uVar1;
  auVar503._0_4_ = uVar1;
  auVar503._8_4_ = uVar1;
  auVar503._12_4_ = uVar1;
  auVar102 = pshuflw(ZEXT416(0x62f0),ZEXT416(0x62f0),0);
  uVar1 = auVar102._0_4_;
  auVar102._4_4_ = uVar1;
  auVar102._0_4_ = uVar1;
  auVar102._8_4_ = uVar1;
  auVar102._12_4_ = uVar1;
  auVar246 = pmulhrsw(auVar503,(undefined1  [16])input[0x1c]);
  auVar102 = pmulhrsw(auVar102,(undefined1  [16])input[0x1c]);
  auVar104 = pshuflw(ZEXT416(0x3c58),ZEXT416(0x3c58),0);
  uVar1 = auVar104._0_4_;
  auVar104._4_4_ = uVar1;
  auVar104._0_4_ = uVar1;
  auVar104._8_4_ = uVar1;
  auVar104._12_4_ = uVar1;
  auVar177 = pshuflw(ZEXT416(0x70e0),ZEXT416(0x70e0),0);
  uVar1 = auVar177._0_4_;
  auVar8._4_4_ = uVar1;
  auVar8._0_4_ = uVar1;
  auVar8._8_4_ = uVar1;
  auVar8._12_4_ = uVar1;
  auVar104 = pmulhrsw(auVar104,(undefined1  [16])input[0x14]);
  auVar248 = pmulhrsw(auVar8,(undefined1  [16])input[0x14]);
  auVar177 = pshuflw(ZEXT416(0xffffdad8),ZEXT416(0xffffdad8),0);
  uVar1 = auVar177._0_4_;
  auVar177._4_4_ = uVar1;
  auVar177._0_4_ = uVar1;
  auVar177._8_4_ = uVar1;
  auVar177._12_4_ = uVar1;
  auVar181 = pshuflw(ZEXT416(0x7a80),ZEXT416(0x7a80),0);
  uVar1 = auVar181._0_4_;
  auVar9._4_4_ = uVar1;
  auVar9._0_4_ = uVar1;
  auVar9._8_4_ = uVar1;
  auVar9._12_4_ = uVar1;
  auVar177 = pmulhrsw(auVar177,(undefined1  [16])input[0xc]);
  auVar250 = pmulhrsw(auVar9,(undefined1  [16])input[0xc]);
  auVar316 = paddsw(auVar187,auVar189);
  auVar181 = psubsw(auVar187,auVar189);
  auVar183 = psubsw(auVar193,auVar191);
  auVar317 = paddsw(auVar193,auVar191);
  auVar318 = paddsw(auVar195,auVar354);
  auVar185 = psubsw(auVar195,auVar354);
  auVar187 = psubsw(auVar430,auVar197);
  auVar431 = paddsw(auVar430,auVar197);
  auVar198 = paddsw(auVar387,auVar124);
  auVar388 = psubsw(auVar387,auVar124);
  auVar124 = psubsw(auVar120,auVar122);
  auVar189 = paddsw(auVar122,auVar120);
  auVar191 = paddsw(auVar118,auVar116);
  auVar116 = psubsw(auVar118,auVar116);
  auVar389 = psubsw(auVar112,auVar114);
  auVar195 = paddsw(auVar114,auVar112);
  auVar202._0_12_ = auVar373._0_12_;
  auVar202._12_2_ = auVar373._6_2_;
  auVar202._14_2_ = auVar513._6_2_;
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._0_10_ = auVar373._0_10_;
  auVar201._10_2_ = auVar513._4_2_;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200._0_8_ = auVar373._0_8_;
  auVar200._8_2_ = auVar373._4_2_;
  auVar199._8_8_ = auVar200._8_8_;
  auVar199._6_2_ = auVar513._2_2_;
  auVar199._4_2_ = auVar373._2_2_;
  auVar199._0_2_ = auVar373._0_2_;
  auVar199._2_2_ = auVar513._0_2_;
  auVar374._2_2_ = auVar513._8_2_;
  auVar374._0_2_ = auVar373._8_2_;
  auVar374._4_2_ = auVar373._10_2_;
  auVar374._6_2_ = auVar513._10_2_;
  auVar374._8_2_ = auVar373._12_2_;
  auVar374._10_2_ = auVar513._12_2_;
  auVar374._12_2_ = auVar373._14_2_;
  auVar374._14_2_ = auVar513._14_2_;
  auVar112._8_4_ = 0xfec0191;
  auVar112._0_8_ = 0xfec01910fec0191;
  auVar112._12_4_ = 0xfec0191;
  auVar118 = pmaddwd(auVar199,auVar112);
  auVar122 = pmaddwd(auVar374,auVar112);
  auVar114._8_4_ = 0x191f014;
  auVar114._0_8_ = 0x191f0140191f014;
  auVar114._12_4_ = 0x191f014;
  auVar120 = pmaddwd(auVar199,auVar114);
  auVar112 = pmaddwd(auVar374,auVar114);
  auVar253._0_4_ = auVar120._0_4_ + 0x800 >> 0xc;
  auVar253._4_4_ = auVar120._4_4_ + 0x800 >> 0xc;
  auVar253._8_4_ = auVar120._8_4_ + 0x800 >> 0xc;
  auVar253._12_4_ = auVar120._12_4_ + 0x800 >> 0xc;
  auVar125._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar125._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar125._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar125._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar513 = packssdw(auVar253,auVar125);
  auVar203._0_4_ = auVar118._0_4_ + 0x800 >> 0xc;
  auVar203._4_4_ = auVar118._4_4_ + 0x800 >> 0xc;
  auVar203._8_4_ = auVar118._8_4_ + 0x800 >> 0xc;
  auVar203._12_4_ = auVar118._12_4_ + 0x800 >> 0xc;
  auVar375._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar375._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar375._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar375._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar204 = packssdw(auVar203,auVar375);
  local_2d8 = auVar488._0_2_;
  uStack_2d6 = auVar488._2_2_;
  uStack_2d4 = auVar488._4_2_;
  uStack_2d2 = auVar488._6_2_;
  uStack_2d0 = auVar488._8_2_;
  uStack_2ce = auVar488._10_2_;
  uStack_2cc = auVar488._12_2_;
  uStack_2ca = auVar488._14_2_;
  auVar208._0_12_ = auVar489._0_12_;
  auVar208._12_2_ = auVar489._6_2_;
  auVar208._14_2_ = uStack_2d2;
  auVar207._12_4_ = auVar208._12_4_;
  auVar207._0_10_ = auVar489._0_10_;
  auVar207._10_2_ = uStack_2d4;
  auVar206._10_6_ = auVar207._10_6_;
  auVar206._0_8_ = auVar489._0_8_;
  auVar206._8_2_ = auVar489._4_2_;
  auVar205._8_8_ = auVar206._8_8_;
  auVar205._6_2_ = uStack_2d6;
  auVar205._4_2_ = auVar489._2_2_;
  auVar205._0_2_ = auVar489._0_2_;
  auVar205._2_2_ = local_2d8;
  auVar490._2_2_ = uStack_2d0;
  auVar490._0_2_ = auVar489._8_2_;
  auVar490._4_2_ = auVar489._10_2_;
  auVar490._6_2_ = uStack_2ce;
  auVar490._8_2_ = auVar489._12_2_;
  auVar490._10_2_ = uStack_2cc;
  auVar490._12_2_ = auVar489._14_2_;
  auVar490._14_2_ = uStack_2ca;
  auVar126._8_4_ = 0xf014fe6f;
  auVar126._0_8_ = 0xf014fe6ff014fe6f;
  auVar126._12_4_ = 0xf014fe6f;
  auVar120 = pmaddwd(auVar205,auVar126);
  auVar112 = pmaddwd(auVar126,auVar490);
  auVar118 = pmaddwd(auVar205,auVar114);
  auVar114 = pmaddwd(auVar490,auVar114);
  auVar376._0_4_ = auVar120._0_4_ + 0x800 >> 0xc;
  auVar376._4_4_ = auVar120._4_4_ + 0x800 >> 0xc;
  auVar376._8_4_ = auVar120._8_4_ + 0x800 >> 0xc;
  auVar376._12_4_ = auVar120._12_4_ + 0x800 >> 0xc;
  auVar127._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar127._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar127._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar127._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar354 = packssdw(auVar376,auVar127);
  auVar209._0_4_ = auVar118._0_4_ + 0x800 >> 0xc;
  auVar209._4_4_ = auVar118._4_4_ + 0x800 >> 0xc;
  auVar209._8_4_ = auVar118._8_4_ + 0x800 >> 0xc;
  auVar209._12_4_ = auVar118._12_4_ + 0x800 >> 0xc;
  auVar491._0_4_ = auVar114._0_4_ + 0x800 >> 0xc;
  auVar491._4_4_ = auVar114._4_4_ + 0x800 >> 0xc;
  auVar491._8_4_ = auVar114._8_4_ + 0x800 >> 0xc;
  auVar491._12_4_ = auVar114._12_4_ + 0x800 >> 0xc;
  auVar489 = packssdw(auVar209,auVar491);
  local_3e8 = auVar457._0_2_;
  uStack_3e6 = auVar457._2_2_;
  uStack_3e4 = auVar457._4_2_;
  uStack_3e2 = auVar457._6_2_;
  uStack_3e0 = auVar457._8_2_;
  uStack_3de = auVar457._10_2_;
  uStack_3dc = auVar457._12_2_;
  uStack_3da = auVar457._14_2_;
  auVar213._0_12_ = auVar514._0_12_;
  auVar213._12_2_ = auVar514._6_2_;
  auVar213._14_2_ = uStack_3e2;
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._0_10_ = auVar514._0_10_;
  auVar212._10_2_ = uStack_3e4;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._0_8_ = auVar514._0_8_;
  auVar211._8_2_ = auVar514._4_2_;
  auVar210._8_8_ = auVar211._8_8_;
  auVar210._6_2_ = uStack_3e6;
  auVar210._4_2_ = auVar514._2_2_;
  auVar210._0_2_ = auVar514._0_2_;
  auVar210._2_2_ = local_3e8;
  auVar515._2_2_ = uStack_3e0;
  auVar515._0_2_ = auVar514._8_2_;
  auVar515._4_2_ = auVar514._10_2_;
  auVar515._6_2_ = uStack_3de;
  auVar515._8_2_ = auVar514._12_2_;
  auVar515._10_2_ = uStack_3dc;
  auVar515._12_2_ = auVar514._14_2_;
  auVar515._14_2_ = uStack_3da;
  auVar118._8_4_ = 0xa260c5e;
  auVar118._0_8_ = 0xa260c5e0a260c5e;
  auVar118._12_4_ = 0xa260c5e;
  auVar122 = pmaddwd(auVar210,auVar118);
  auVar118 = pmaddwd(auVar515,auVar118);
  auVar120._8_4_ = 0xc5ef5da;
  auVar120._0_8_ = 0xc5ef5da0c5ef5da;
  auVar120._12_4_ = 0xc5ef5da;
  auVar112 = pmaddwd(auVar210,auVar120);
  auVar114 = pmaddwd(auVar515,auVar120);
  auVar10._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar10._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar10._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar10._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar128._0_4_ = auVar114._0_4_ + 0x800 >> 0xc;
  auVar128._4_4_ = auVar114._4_4_ + 0x800 >> 0xc;
  auVar128._8_4_ = auVar114._8_4_ + 0x800 >> 0xc;
  auVar128._12_4_ = auVar114._12_4_ + 0x800 >> 0xc;
  auVar114 = packssdw(auVar10,auVar128);
  auVar214._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar214._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar214._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar214._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar516._0_4_ = auVar118._0_4_ + 0x800 >> 0xc;
  auVar516._4_4_ = auVar118._4_4_ + 0x800 >> 0xc;
  auVar516._8_4_ = auVar118._8_4_ + 0x800 >> 0xc;
  auVar516._12_4_ = auVar118._12_4_ + 0x800 >> 0xc;
  auVar193 = packssdw(auVar214,auVar516);
  local_3c8 = auVar403._0_2_;
  uStack_3c6 = auVar403._2_2_;
  uStack_3c4 = auVar403._4_2_;
  uStack_3c2 = auVar403._6_2_;
  uStack_3c0 = auVar403._8_2_;
  uStack_3be = auVar403._10_2_;
  uStack_3bc = auVar403._12_2_;
  uStack_3ba = auVar403._14_2_;
  auVar257._0_12_ = auVar335._0_12_;
  auVar257._12_2_ = auVar335._6_2_;
  auVar257._14_2_ = uStack_3c2;
  auVar256._12_4_ = auVar257._12_4_;
  auVar256._0_10_ = auVar335._0_10_;
  auVar256._10_2_ = uStack_3c4;
  auVar255._10_6_ = auVar256._10_6_;
  auVar255._0_8_ = auVar335._0_8_;
  auVar255._8_2_ = auVar335._4_2_;
  auVar254._8_8_ = auVar255._8_8_;
  auVar254._6_2_ = uStack_3c6;
  auVar254._4_2_ = auVar335._2_2_;
  auVar254._0_2_ = auVar335._0_2_;
  auVar254._2_2_ = local_3c8;
  auVar336._2_2_ = uStack_3c0;
  auVar336._0_2_ = auVar335._8_2_;
  auVar336._4_2_ = auVar335._10_2_;
  auVar336._6_2_ = uStack_3be;
  auVar336._8_2_ = auVar335._12_2_;
  auVar336._10_2_ = uStack_3bc;
  auVar336._12_2_ = auVar335._14_2_;
  auVar336._14_2_ = uStack_3ba;
  auVar129._8_4_ = 0xf5daf3a2;
  auVar129._0_8_ = 0xf5daf3a2f5daf3a2;
  auVar129._12_4_ = 0xf5daf3a2;
  auVar112 = pmaddwd(auVar254,auVar129);
  auVar118 = pmaddwd(auVar129,auVar336);
  auVar122 = pmaddwd(auVar254,auVar120);
  auVar120 = pmaddwd(auVar336,auVar120);
  auVar11._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar11._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar11._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar11._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar130._0_4_ = auVar118._0_4_ + 0x800 >> 0xc;
  auVar130._4_4_ = auVar118._4_4_ + 0x800 >> 0xc;
  auVar130._8_4_ = auVar118._8_4_ + 0x800 >> 0xc;
  auVar130._12_4_ = auVar118._12_4_ + 0x800 >> 0xc;
  auVar118 = packssdw(auVar11,auVar130);
  auVar258._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar258._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar258._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar258._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar337._0_4_ = auVar120._0_4_ + 0x800 >> 0xc;
  auVar337._4_4_ = auVar120._4_4_ + 0x800 >> 0xc;
  auVar337._8_4_ = auVar120._8_4_ + 0x800 >> 0xc;
  auVar337._12_4_ = auVar120._12_4_ + 0x800 >> 0xc;
  auVar430 = packssdw(auVar258,auVar337);
  local_3f8 = auVar252._0_2_;
  uStack_3f6 = auVar252._2_2_;
  uStack_3f4 = auVar252._4_2_;
  uStack_3f2 = auVar252._6_2_;
  uStack_3f0 = auVar252._8_2_;
  uStack_3ee = auVar252._10_2_;
  uStack_3ec = auVar252._12_2_;
  uStack_3ea = auVar252._14_2_;
  auVar15._0_12_ = auVar458._0_12_;
  auVar15._12_2_ = auVar458._6_2_;
  auVar15._14_2_ = uStack_3f2;
  auVar14._12_4_ = auVar15._12_4_;
  auVar14._0_10_ = auVar458._0_10_;
  auVar14._10_2_ = uStack_3f4;
  auVar13._10_6_ = auVar14._10_6_;
  auVar13._0_8_ = auVar458._0_8_;
  auVar13._8_2_ = auVar458._4_2_;
  auVar12._8_8_ = auVar13._8_8_;
  auVar12._6_2_ = uStack_3f6;
  auVar12._4_2_ = auVar458._2_2_;
  auVar12._0_2_ = auVar458._0_2_;
  auVar12._2_2_ = local_3f8;
  auVar459._2_2_ = uStack_3f0;
  auVar459._0_2_ = auVar458._8_2_;
  auVar459._4_2_ = auVar458._10_2_;
  auVar459._6_2_ = uStack_3ee;
  auVar459._8_2_ = auVar458._12_2_;
  auVar459._10_2_ = uStack_3ec;
  auVar459._12_2_ = auVar458._14_2_;
  auVar459._14_2_ = uStack_3ea;
  auVar252._8_4_ = 0xe1c078b;
  auVar252._0_8_ = 0xe1c078b0e1c078b;
  auVar252._12_4_ = 0xe1c078b;
  auVar112 = pmaddwd(auVar12,auVar252);
  auVar197 = pmaddwd(auVar459,auVar252);
  auVar122._8_4_ = 0x78bf1e4;
  auVar122._0_8_ = 0x78bf1e4078bf1e4;
  auVar122._12_4_ = 0x78bf1e4;
  auVar252 = pmaddwd(auVar12,auVar122);
  auVar120 = pmaddwd(auVar459,auVar122);
  auVar215._0_4_ = auVar252._0_4_ + 0x800 >> 0xc;
  auVar215._4_4_ = auVar252._4_4_ + 0x800 >> 0xc;
  auVar215._8_4_ = auVar252._8_4_ + 0x800 >> 0xc;
  auVar215._12_4_ = auVar252._12_4_ + 0x800 >> 0xc;
  auVar131._0_4_ = auVar120._0_4_ + 0x800 >> 0xc;
  auVar131._4_4_ = auVar120._4_4_ + 0x800 >> 0xc;
  auVar131._8_4_ = auVar120._8_4_ + 0x800 >> 0xc;
  auVar131._12_4_ = auVar120._12_4_ + 0x800 >> 0xc;
  auVar488 = packssdw(auVar215,auVar131);
  auVar16._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar16._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar16._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar16._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar460._0_4_ = auVar197._0_4_ + 0x800 >> 0xc;
  auVar460._4_4_ = auVar197._4_4_ + 0x800 >> 0xc;
  auVar460._8_4_ = auVar197._8_4_ + 0x800 >> 0xc;
  auVar460._12_4_ = auVar197._12_4_ + 0x800 >> 0xc;
  auVar120 = packssdw(auVar16,auVar460);
  local_468 = auVar372._0_2_;
  uStack_466 = auVar372._2_2_;
  uStack_464 = auVar372._4_2_;
  uStack_462 = auVar372._6_2_;
  uStack_460 = auVar372._8_2_;
  uStack_45e = auVar372._10_2_;
  uStack_45c = auVar372._12_2_;
  uStack_45a = auVar372._14_2_;
  auVar262._0_12_ = auVar288._0_12_;
  auVar262._12_2_ = auVar288._6_2_;
  auVar262._14_2_ = uStack_462;
  auVar261._12_4_ = auVar262._12_4_;
  auVar261._0_10_ = auVar288._0_10_;
  auVar261._10_2_ = uStack_464;
  auVar260._10_6_ = auVar261._10_6_;
  auVar260._0_8_ = auVar288._0_8_;
  auVar260._8_2_ = auVar288._4_2_;
  auVar259._8_8_ = auVar260._8_8_;
  auVar259._6_2_ = uStack_466;
  auVar259._4_2_ = auVar288._2_2_;
  auVar259._0_2_ = auVar288._0_2_;
  auVar259._2_2_ = local_468;
  auVar289._2_2_ = uStack_460;
  auVar289._0_2_ = auVar288._8_2_;
  auVar289._4_2_ = auVar288._10_2_;
  auVar289._6_2_ = uStack_45e;
  auVar289._8_2_ = auVar288._12_2_;
  auVar289._10_2_ = uStack_45c;
  auVar289._12_2_ = auVar288._14_2_;
  auVar289._14_2_ = uStack_45a;
  auVar132._8_4_ = 0xf1e4f875;
  auVar132._0_8_ = 0xf1e4f875f1e4f875;
  auVar132._12_4_ = 0xf1e4f875;
  auVar112 = pmaddwd(auVar259,auVar132);
  auVar252 = pmaddwd(auVar132,auVar289);
  auVar372 = pmaddwd(auVar259,auVar122);
  auVar122 = pmaddwd(auVar289,auVar122);
  auVar17._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar17._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar17._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar17._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar133._0_4_ = auVar252._0_4_ + 0x800 >> 0xc;
  auVar133._4_4_ = auVar252._4_4_ + 0x800 >> 0xc;
  auVar133._8_4_ = auVar252._8_4_ + 0x800 >> 0xc;
  auVar133._12_4_ = auVar252._12_4_ + 0x800 >> 0xc;
  auVar252 = packssdw(auVar17,auVar133);
  auVar263._0_4_ = auVar372._0_4_ + 0x800 >> 0xc;
  auVar263._4_4_ = auVar372._4_4_ + 0x800 >> 0xc;
  auVar263._8_4_ = auVar372._8_4_ + 0x800 >> 0xc;
  auVar263._12_4_ = auVar372._12_4_ + 0x800 >> 0xc;
  auVar290._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar290._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar290._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar290._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar387 = packssdw(auVar263,auVar290);
  local_478 = auVar314._0_2_;
  uStack_476 = auVar314._2_2_;
  uStack_474 = auVar314._4_2_;
  uStack_472 = auVar314._6_2_;
  uStack_470 = auVar314._8_2_;
  uStack_46e = auVar314._10_2_;
  uStack_46c = auVar314._12_2_;
  uStack_46a = auVar314._14_2_;
  auVar219._0_12_ = auVar332._0_12_;
  auVar219._12_2_ = auVar332._6_2_;
  auVar219._14_2_ = uStack_472;
  auVar218._12_4_ = auVar219._12_4_;
  auVar218._0_10_ = auVar332._0_10_;
  auVar218._10_2_ = uStack_474;
  auVar217._10_6_ = auVar218._10_6_;
  auVar217._0_8_ = auVar332._0_8_;
  auVar217._8_2_ = auVar332._4_2_;
  auVar216._8_8_ = auVar217._8_8_;
  auVar216._6_2_ = uStack_476;
  auVar216._4_2_ = auVar332._2_2_;
  auVar216._0_2_ = auVar332._0_2_;
  auVar216._2_2_ = local_478;
  auVar134._2_2_ = uStack_470;
  auVar134._0_2_ = auVar332._8_2_;
  auVar134._4_2_ = auVar332._10_2_;
  auVar134._6_2_ = uStack_46e;
  auVar134._8_2_ = auVar332._12_2_;
  auVar134._10_2_ = uStack_46c;
  auVar134._12_2_ = auVar332._14_2_;
  auVar134._14_2_ = uStack_46a;
  auVar332._8_4_ = 0x4a50f50;
  auVar332._0_8_ = 0x4a50f5004a50f50;
  auVar332._12_4_ = 0x4a50f50;
  auVar372 = pmaddwd(auVar216,auVar332);
  auVar122 = pmaddwd(auVar134,auVar332);
  auVar314._8_4_ = 0xf50fb5b;
  auVar314._0_8_ = 0xf50fb5b0f50fb5b;
  auVar314._12_4_ = 0xf50fb5b;
  auVar332 = pmaddwd(auVar216,auVar314);
  auVar112 = pmaddwd(auVar134,auVar314);
  auVar355._0_4_ = auVar332._0_4_ + 0x800 >> 0xc;
  auVar355._4_4_ = auVar332._4_4_ + 0x800 >> 0xc;
  auVar355._8_4_ = auVar332._8_4_ + 0x800 >> 0xc;
  auVar355._12_4_ = auVar332._12_4_ + 0x800 >> 0xc;
  auVar18._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar18._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar18._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar18._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar288 = packssdw(auVar355,auVar18);
  auVar220._0_4_ = auVar372._0_4_ + 0x800 >> 0xc;
  auVar220._4_4_ = auVar372._4_4_ + 0x800 >> 0xc;
  auVar220._8_4_ = auVar372._8_4_ + 0x800 >> 0xc;
  auVar220._12_4_ = auVar372._12_4_ + 0x800 >> 0xc;
  auVar135._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar135._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar135._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar135._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar335 = packssdw(auVar220,auVar135);
  local_388 = auVar334._0_2_;
  uStack_386 = auVar334._2_2_;
  uStack_384 = auVar334._4_2_;
  uStack_382 = auVar334._6_2_;
  uStack_380 = auVar334._8_2_;
  uStack_37e = auVar334._10_2_;
  uStack_37c = auVar334._12_2_;
  uStack_37a = auVar334._14_2_;
  auVar139._0_12_ = auVar404._0_12_;
  auVar139._12_2_ = auVar404._6_2_;
  auVar139._14_2_ = uStack_382;
  auVar138._12_4_ = auVar139._12_4_;
  auVar138._0_10_ = auVar404._0_10_;
  auVar138._10_2_ = uStack_384;
  auVar137._10_6_ = auVar138._10_6_;
  auVar137._0_8_ = auVar404._0_8_;
  auVar137._8_2_ = auVar404._4_2_;
  auVar136._8_8_ = auVar137._8_8_;
  auVar136._6_2_ = uStack_386;
  auVar136._4_2_ = auVar404._2_2_;
  auVar136._0_2_ = auVar404._0_2_;
  auVar136._2_2_ = local_388;
  auVar405._2_2_ = uStack_380;
  auVar405._0_2_ = auVar404._8_2_;
  auVar405._4_2_ = auVar404._10_2_;
  auVar405._6_2_ = uStack_37e;
  auVar405._8_2_ = auVar404._12_2_;
  auVar405._10_2_ = uStack_37c;
  auVar405._12_2_ = auVar404._14_2_;
  auVar405._14_2_ = uStack_37a;
  auVar19._8_4_ = 0xfb5bf0b0;
  auVar19._0_8_ = 0xfb5bf0b0fb5bf0b0;
  auVar19._12_4_ = 0xfb5bf0b0;
  auVar334 = pmaddwd(auVar136,auVar19);
  auVar112 = pmaddwd(auVar19,auVar405);
  auVar122 = pmaddwd(auVar136,auVar314);
  auVar332 = pmaddwd(auVar405,auVar314);
  auVar432._0_4_ = auVar334._0_4_ + 0x800 >> 0xc;
  auVar432._4_4_ = auVar334._4_4_ + 0x800 >> 0xc;
  auVar432._8_4_ = auVar334._8_4_ + 0x800 >> 0xc;
  auVar432._12_4_ = auVar334._12_4_ + 0x800 >> 0xc;
  auVar20._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar20._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar20._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar20._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar373 = packssdw(auVar432,auVar20);
  auVar140._0_4_ = auVar122._0_4_ + 0x800 >> 0xc;
  auVar140._4_4_ = auVar122._4_4_ + 0x800 >> 0xc;
  auVar140._8_4_ = auVar122._8_4_ + 0x800 >> 0xc;
  auVar140._12_4_ = auVar122._12_4_ + 0x800 >> 0xc;
  auVar406._0_4_ = auVar332._0_4_ + 0x800 >> 0xc;
  auVar406._4_4_ = auVar332._4_4_ + 0x800 >> 0xc;
  auVar406._8_4_ = auVar332._8_4_ + 0x800 >> 0xc;
  auVar406._12_4_ = auVar332._12_4_ + 0x800 >> 0xc;
  auVar372 = packssdw(auVar140,auVar406);
  auVar112 = pshuflw(ZEXT416(0x18f8),ZEXT416(0x18f8),0);
  uVar1 = auVar112._0_4_;
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar112 = pshuflw(ZEXT416(0x7d88),ZEXT416(0x7d88),0);
  uVar1 = auVar112._0_4_;
  auVar141._4_4_ = uVar1;
  auVar141._0_4_ = uVar1;
  auVar141._8_4_ = uVar1;
  auVar141._12_4_ = uVar1;
  auVar122 = pmulhrsw(auVar21,(undefined1  [16])input[8]);
  auVar197 = pmulhrsw(auVar141,(undefined1  [16])input[8]);
  auVar112 = pshuflw(ZEXT416(0xffffb8e0),ZEXT416(0xffffb8e0),0);
  uVar1 = auVar112._0_4_;
  auVar517._4_4_ = uVar1;
  auVar517._0_4_ = uVar1;
  auVar517._8_4_ = uVar1;
  auVar517._12_4_ = uVar1;
  auVar112 = pshuflw(ZEXT416(0x6a70),ZEXT416(0x6a70),0);
  uVar1 = auVar112._0_4_;
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar518 = pmulhrsw(auVar517,(undefined1  [16])input[0x18]);
  auVar332 = pmulhrsw(auVar22,(undefined1  [16])input[0x18]);
  auVar404 = paddsw(auVar244,auVar246);
  auVar112 = psubsw(auVar244,auVar246);
  auVar403 = psubsw(auVar177,auVar104);
  auVar104 = paddsw(auVar177,auVar104);
  auVar458 = paddsw(auVar250,auVar248);
  auVar177 = psubsw(auVar250,auVar248);
  auVar244 = psubsw(auVar96,auVar102);
  auVar96 = paddsw(auVar102,auVar96);
  auVar464._0_12_ = auVar181._0_12_;
  auVar464._12_2_ = auVar181._6_2_;
  auVar464._14_2_ = auVar389._6_2_;
  auVar463._12_4_ = auVar464._12_4_;
  auVar463._0_10_ = auVar181._0_10_;
  auVar463._10_2_ = auVar389._4_2_;
  auVar462._10_6_ = auVar463._10_6_;
  auVar462._0_8_ = auVar181._0_8_;
  auVar462._8_2_ = auVar181._4_2_;
  auVar461._8_8_ = auVar462._8_8_;
  auVar461._6_2_ = auVar389._2_2_;
  auVar461._4_2_ = auVar181._2_2_;
  auVar461._0_2_ = auVar181._0_2_;
  auVar461._2_2_ = auVar389._0_2_;
  auVar23._2_2_ = auVar389._8_2_;
  auVar23._0_2_ = auVar181._8_2_;
  auVar23._4_2_ = auVar181._10_2_;
  auVar23._6_2_ = auVar389._10_2_;
  auVar23._8_2_ = auVar181._12_2_;
  auVar23._10_2_ = auVar389._12_2_;
  auVar23._12_2_ = auVar181._14_2_;
  auVar23._14_2_ = auVar389._14_2_;
  auVar319._8_4_ = 0x31ff04f;
  auVar319._0_8_ = 0x31ff04f031ff04f;
  auVar319._12_4_ = 0x31ff04f;
  auVar181 = pmaddwd(auVar461,auVar319);
  auVar102 = pmaddwd(auVar23,auVar319);
  auVar142._0_4_ = auVar181._0_4_ + 0x800 >> 0xc;
  auVar142._4_4_ = auVar181._4_4_ + 0x800 >> 0xc;
  auVar142._8_4_ = auVar181._8_4_ + 0x800 >> 0xc;
  auVar142._12_4_ = auVar181._12_4_ + 0x800 >> 0xc;
  auVar181._0_4_ = auVar102._0_4_ + 0x800 >> 0xc;
  auVar181._4_4_ = auVar102._4_4_ + 0x800 >> 0xc;
  auVar181._8_4_ = auVar102._8_4_ + 0x800 >> 0xc;
  auVar181._12_4_ = auVar102._12_4_ + 0x800 >> 0xc;
  auVar457 = packssdw(auVar142,auVar181);
  auVar143._8_4_ = 0xfb1031f;
  auVar143._0_8_ = 0xfb1031f0fb1031f;
  auVar143._12_4_ = 0xfb1031f;
  auVar181 = pmaddwd(auVar461,auVar143);
  auVar102 = pmaddwd(auVar23,auVar143);
  auVar465._0_4_ = auVar181._0_4_ + 0x800 >> 0xc;
  auVar465._4_4_ = auVar181._4_4_ + 0x800 >> 0xc;
  auVar465._8_4_ = auVar181._8_4_ + 0x800 >> 0xc;
  auVar465._12_4_ = auVar181._12_4_ + 0x800 >> 0xc;
  auVar334._0_4_ = auVar102._0_4_ + 0x800 >> 0xc;
  auVar334._4_4_ = auVar102._4_4_ + 0x800 >> 0xc;
  auVar334._8_4_ = auVar102._8_4_ + 0x800 >> 0xc;
  auVar334._12_4_ = auVar102._12_4_ + 0x800 >> 0xc;
  auVar466 = packssdw(auVar465,auVar334);
  local_3a8 = auVar116._0_2_;
  uStack_3a6 = auVar116._2_2_;
  uStack_3a4 = auVar116._4_2_;
  uStack_3a2 = auVar116._6_2_;
  uStack_3a0 = auVar116._8_2_;
  uStack_39e = auVar116._10_2_;
  uStack_39c = auVar116._12_2_;
  uStack_39a = auVar116._14_2_;
  auVar27._0_12_ = auVar183._0_12_;
  auVar27._12_2_ = auVar183._6_2_;
  auVar27._14_2_ = uStack_3a2;
  auVar26._12_4_ = auVar27._12_4_;
  auVar26._0_10_ = auVar183._0_10_;
  auVar26._10_2_ = uStack_3a4;
  auVar25._10_6_ = auVar26._10_6_;
  auVar25._0_8_ = auVar183._0_8_;
  auVar25._8_2_ = auVar183._4_2_;
  auVar24._8_8_ = auVar25._8_8_;
  auVar24._6_2_ = uStack_3a6;
  auVar24._4_2_ = auVar183._2_2_;
  auVar24._0_2_ = auVar183._0_2_;
  auVar24._2_2_ = local_3a8;
  auVar144._2_2_ = uStack_3a0;
  auVar144._0_2_ = auVar183._8_2_;
  auVar144._4_2_ = auVar183._10_2_;
  auVar144._6_2_ = uStack_39e;
  auVar144._8_2_ = auVar183._12_2_;
  auVar144._10_2_ = uStack_39c;
  auVar144._12_2_ = auVar183._14_2_;
  auVar144._14_2_ = uStack_39a;
  auVar291._8_4_ = 0xf04ffce1;
  auVar291._0_8_ = 0xf04ffce1f04ffce1;
  auVar291._12_4_ = 0xf04ffce1;
  auVar181 = pmaddwd(auVar24,auVar291);
  auVar102 = pmaddwd(auVar144,auVar291);
  auVar264._0_4_ = auVar181._0_4_ + 0x800 >> 0xc;
  auVar264._4_4_ = auVar181._4_4_ + 0x800 >> 0xc;
  auVar264._8_4_ = auVar181._8_4_ + 0x800 >> 0xc;
  auVar264._12_4_ = auVar181._12_4_ + 0x800 >> 0xc;
  auVar183._0_4_ = auVar102._0_4_ + 0x800 >> 0xc;
  auVar183._4_4_ = auVar102._4_4_ + 0x800 >> 0xc;
  auVar183._8_4_ = auVar102._8_4_ + 0x800 >> 0xc;
  auVar183._12_4_ = auVar102._12_4_ + 0x800 >> 0xc;
  auVar389 = packssdw(auVar264,auVar183);
  auVar181 = pmaddwd(auVar24,auVar319);
  auVar102 = pmaddwd(auVar144,auVar319);
  auVar28._0_4_ = auVar181._0_4_ + 0x800 >> 0xc;
  auVar28._4_4_ = auVar181._4_4_ + 0x800 >> 0xc;
  auVar28._8_4_ = auVar181._8_4_ + 0x800 >> 0xc;
  auVar28._12_4_ = auVar181._12_4_ + 0x800 >> 0xc;
  auVar116._0_4_ = auVar102._0_4_ + 0x800 >> 0xc;
  auVar116._4_4_ = auVar102._4_4_ + 0x800 >> 0xc;
  auVar116._8_4_ = auVar102._8_4_ + 0x800 >> 0xc;
  auVar116._12_4_ = auVar102._12_4_ + 0x800 >> 0xc;
  auVar314 = packssdw(auVar28,auVar116);
  local_138 = auVar124._0_2_;
  uStack_136 = auVar124._2_2_;
  uStack_134 = auVar124._4_2_;
  uStack_132 = auVar124._6_2_;
  uStack_130 = auVar124._8_2_;
  uStack_12e = auVar124._10_2_;
  uStack_12c = auVar124._12_2_;
  uStack_12a = auVar124._14_2_;
  auVar495._0_12_ = auVar185._0_12_;
  auVar495._12_2_ = auVar185._6_2_;
  auVar495._14_2_ = uStack_132;
  auVar494._12_4_ = auVar495._12_4_;
  auVar494._0_10_ = auVar185._0_10_;
  auVar494._10_2_ = uStack_134;
  auVar493._10_6_ = auVar494._10_6_;
  auVar493._0_8_ = auVar185._0_8_;
  auVar493._8_2_ = auVar185._4_2_;
  auVar492._8_8_ = auVar493._8_8_;
  auVar492._6_2_ = uStack_136;
  auVar492._4_2_ = auVar185._2_2_;
  auVar492._0_2_ = auVar185._0_2_;
  auVar492._2_2_ = local_138;
  auVar145._2_2_ = uStack_130;
  auVar145._0_2_ = auVar185._8_2_;
  auVar145._4_2_ = auVar185._10_2_;
  auVar145._6_2_ = uStack_12e;
  auVar145._8_2_ = auVar185._12_2_;
  auVar145._10_2_ = uStack_12c;
  auVar145._12_2_ = auVar185._14_2_;
  auVar145._14_2_ = uStack_12a;
  auVar292._8_4_ = 0xd4ef71c;
  auVar292._0_8_ = 0xd4ef71c0d4ef71c;
  auVar292._12_4_ = 0xd4ef71c;
  auVar181 = pmaddwd(auVar492,auVar292);
  auVar102 = pmaddwd(auVar145,auVar292);
  auVar407._0_4_ = auVar181._0_4_ + 0x800 >> 0xc;
  auVar407._4_4_ = auVar181._4_4_ + 0x800 >> 0xc;
  auVar407._8_4_ = auVar181._8_4_ + 0x800 >> 0xc;
  auVar407._12_4_ = auVar181._12_4_ + 0x800 >> 0xc;
  auVar29._0_4_ = auVar102._0_4_ + 0x800 >> 0xc;
  auVar29._4_4_ = auVar102._4_4_ + 0x800 >> 0xc;
  auVar29._8_4_ = auVar102._8_4_ + 0x800 >> 0xc;
  auVar29._12_4_ = auVar102._12_4_ + 0x800 >> 0xc;
  auVar408 = packssdw(auVar407,auVar29);
  auVar185._8_4_ = 0x8e40d4e;
  auVar185._0_8_ = 0x8e40d4e08e40d4e;
  auVar185._12_4_ = 0x8e40d4e;
  auVar181 = pmaddwd(auVar492,auVar185);
  auVar102 = pmaddwd(auVar145,auVar185);
  auVar496._0_4_ = auVar181._0_4_ + 0x800 >> 0xc;
  auVar496._4_4_ = auVar181._4_4_ + 0x800 >> 0xc;
  auVar496._8_4_ = auVar181._8_4_ + 0x800 >> 0xc;
  auVar496._12_4_ = auVar181._12_4_ + 0x800 >> 0xc;
  auVar30._0_4_ = auVar102._0_4_ + 0x800 >> 0xc;
  auVar30._4_4_ = auVar102._4_4_ + 0x800 >> 0xc;
  auVar30._8_4_ = auVar102._8_4_ + 0x800 >> 0xc;
  auVar30._12_4_ = auVar102._12_4_ + 0x800 >> 0xc;
  auVar497 = packssdw(auVar496,auVar30);
  local_208 = auVar388._0_2_;
  uStack_206 = auVar388._2_2_;
  uStack_204 = auVar388._4_2_;
  uStack_202 = auVar388._6_2_;
  uStack_200 = auVar388._8_2_;
  uStack_1fe = auVar388._10_2_;
  uStack_1fc = auVar388._12_2_;
  uStack_1fa = auVar388._14_2_;
  auVar323._0_12_ = auVar187._0_12_;
  auVar323._12_2_ = auVar187._6_2_;
  auVar323._14_2_ = uStack_202;
  auVar322._12_4_ = auVar323._12_4_;
  auVar322._0_10_ = auVar187._0_10_;
  auVar322._10_2_ = uStack_204;
  auVar321._10_6_ = auVar322._10_6_;
  auVar321._0_8_ = auVar187._0_8_;
  auVar321._8_2_ = auVar187._4_2_;
  auVar320._8_8_ = auVar321._8_8_;
  auVar320._6_2_ = uStack_206;
  auVar320._4_2_ = auVar187._2_2_;
  auVar320._0_2_ = auVar187._0_2_;
  auVar320._2_2_ = local_208;
  auVar146._2_2_ = uStack_200;
  auVar146._0_2_ = auVar187._8_2_;
  auVar146._4_2_ = auVar187._10_2_;
  auVar146._6_2_ = uStack_1fe;
  auVar146._8_2_ = auVar187._12_2_;
  auVar146._10_2_ = uStack_1fc;
  auVar146._12_2_ = auVar187._14_2_;
  auVar146._14_2_ = uStack_1fa;
  auVar187._8_4_ = 0xf71cf2b2;
  auVar187._0_8_ = 0xf71cf2b2f71cf2b2;
  auVar187._12_4_ = 0xf71cf2b2;
  auVar181 = pmaddwd(auVar320,auVar187);
  auVar102 = pmaddwd(auVar146,auVar187);
  auVar390._0_4_ = auVar181._0_4_ + 0x800 >> 0xc;
  auVar390._4_4_ = auVar181._4_4_ + 0x800 >> 0xc;
  auVar390._8_4_ = auVar181._8_4_ + 0x800 >> 0xc;
  auVar390._12_4_ = auVar181._12_4_ + 0x800 >> 0xc;
  auVar31._0_4_ = auVar102._0_4_ + 0x800 >> 0xc;
  auVar31._4_4_ = auVar102._4_4_ + 0x800 >> 0xc;
  auVar31._8_4_ = auVar102._8_4_ + 0x800 >> 0xc;
  auVar31._12_4_ = auVar102._12_4_ + 0x800 >> 0xc;
  auVar391 = packssdw(auVar390,auVar31);
  auVar181 = pmaddwd(auVar320,auVar292);
  auVar102 = pmaddwd(auVar146,auVar292);
  auVar324._0_4_ = auVar181._0_4_ + 0x800 >> 0xc;
  auVar324._4_4_ = auVar181._4_4_ + 0x800 >> 0xc;
  auVar324._8_4_ = auVar181._8_4_ + 0x800 >> 0xc;
  auVar324._12_4_ = auVar181._12_4_ + 0x800 >> 0xc;
  auVar32._0_4_ = auVar102._0_4_ + 0x800 >> 0xc;
  auVar32._4_4_ = auVar102._4_4_ + 0x800 >> 0xc;
  auVar32._8_4_ = auVar102._8_4_ + 0x800 >> 0xc;
  auVar32._12_4_ = auVar102._12_4_ + 0x800 >> 0xc;
  auVar325 = packssdw(auVar324,auVar32);
  auVar102 = paddsw(auVar242,auVar2);
  auVar334 = psubsw(auVar242,auVar2);
  auVar242 = paddsw(auVar513,auVar354);
  auVar250 = psubsw(auVar513,auVar354);
  auVar377 = psubsw(auVar97,auVar312);
  auVar2 = paddsw(auVar97,auVar312);
  auVar338 = psubsw(auVar118,auVar114);
  auVar312 = paddsw(auVar118,auVar114);
  auVar97 = paddsw(auVar3,auVar7);
  auVar513 = psubsw(auVar3,auVar7);
  auVar3 = paddsw(auVar488,auVar252);
  auVar488 = psubsw(auVar488,auVar252);
  auVar514 = psubsw(auVar110,auVar98);
  auVar7 = paddsw(auVar110,auVar98);
  auVar98 = psubsw(auVar373,auVar288);
  auVar433 = paddsw(auVar373,auVar288);
  auVar110 = paddsw(auVar179,auVar106);
  auVar288 = psubsw(auVar179,auVar106);
  auVar179 = paddsw(auVar372,auVar335);
  auVar335 = psubsw(auVar372,auVar335);
  auVar354 = psubsw(auVar6,auVar108);
  auVar106 = paddsw(auVar6,auVar108);
  auVar373 = psubsw(auVar120,auVar387);
  auVar108 = paddsw(auVar387,auVar120);
  auVar6 = paddsw(auVar100,auVar4);
  auVar387 = psubsw(auVar100,auVar4);
  auVar100 = paddsw(auVar430,auVar193);
  auVar193 = psubsw(auVar430,auVar193);
  auVar430 = psubsw(auVar315,auVar5);
  auVar4 = paddsw(auVar315,auVar5);
  auVar315 = psubsw(auVar204,auVar489);
  auVar5 = paddsw(auVar489,auVar204);
  auVar181 = pshuflw(ZEXT416(0x30f8),ZEXT416(0x30f8),0);
  uVar1 = auVar181._0_4_;
  auVar124._4_4_ = uVar1;
  auVar124._0_4_ = uVar1;
  auVar124._8_4_ = uVar1;
  auVar124._12_4_ = uVar1;
  auVar181 = pshuflw(ZEXT416(0x7640),ZEXT416(0x7640),0);
  uVar1 = auVar181._0_4_;
  auVar33._4_4_ = uVar1;
  auVar33._0_4_ = uVar1;
  auVar33._8_4_ = uVar1;
  auVar33._12_4_ = uVar1;
  auVar181 = pmulhrsw(auVar124,(undefined1  [16])input[0x10]);
  auVar204 = pmulhrsw(auVar33,(undefined1  [16])input[0x10]);
  auVar183 = paddsw(auVar122,auVar518);
  auVar489 = psubsw(auVar122,auVar518);
  auVar388 = psubsw(auVar197,auVar332);
  auVar124 = paddsw(auVar332,auVar197);
  local_188 = auVar244._0_2_;
  uStack_186 = auVar244._2_2_;
  uStack_184 = auVar244._4_2_;
  uStack_182 = auVar244._6_2_;
  uStack_180 = auVar244._8_2_;
  uStack_17e = auVar244._10_2_;
  uStack_17c = auVar244._12_2_;
  uStack_17a = auVar244._14_2_;
  auVar437._0_12_ = auVar112._0_12_;
  auVar437._12_2_ = auVar112._6_2_;
  auVar437._14_2_ = uStack_182;
  auVar436._12_4_ = auVar437._12_4_;
  auVar436._0_10_ = auVar112._0_10_;
  auVar436._10_2_ = uStack_184;
  auVar435._10_6_ = auVar436._10_6_;
  auVar435._0_8_ = auVar112._0_8_;
  auVar435._8_2_ = auVar112._4_2_;
  auVar434._8_8_ = auVar435._8_8_;
  auVar434._6_2_ = uStack_186;
  auVar434._4_2_ = auVar112._2_2_;
  auVar434._0_2_ = auVar112._0_2_;
  auVar434._2_2_ = local_188;
  auVar147._2_2_ = uStack_180;
  auVar147._0_2_ = auVar112._8_2_;
  auVar147._4_2_ = auVar112._10_2_;
  auVar147._6_2_ = uStack_17e;
  auVar147._8_2_ = auVar112._12_2_;
  auVar147._10_2_ = uStack_17c;
  auVar147._12_2_ = auVar112._14_2_;
  auVar147._14_2_ = uStack_17a;
  auVar34._8_4_ = 0x61ff138;
  auVar34._0_8_ = 0x61ff138061ff138;
  auVar34._12_4_ = 0x61ff138;
  auVar116 = pmaddwd(auVar434,auVar34);
  auVar112 = pmaddwd(auVar147,auVar34);
  auVar372._0_4_ = auVar116._0_4_ + 0x800 >> 0xc;
  auVar372._4_4_ = auVar116._4_4_ + 0x800 >> 0xc;
  auVar372._8_4_ = auVar116._8_4_ + 0x800 >> 0xc;
  auVar372._12_4_ = auVar116._12_4_ + 0x800 >> 0xc;
  auVar356._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar356._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar356._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar356._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar116 = packssdw(auVar372,auVar356);
  auVar244._8_4_ = 0xec8061f;
  auVar244._0_8_ = 0xec8061f0ec8061f;
  auVar244._12_4_ = 0xec8061f;
  auVar114 = pmaddwd(auVar434,auVar244);
  auVar112 = pmaddwd(auVar147,auVar244);
  auVar438._0_4_ = auVar114._0_4_ + 0x800 >> 0xc;
  auVar438._4_4_ = auVar114._4_4_ + 0x800 >> 0xc;
  auVar438._8_4_ = auVar114._8_4_ + 0x800 >> 0xc;
  auVar438._12_4_ = auVar114._12_4_ + 0x800 >> 0xc;
  auVar357._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar357._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar357._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar357._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar439 = packssdw(auVar438,auVar357);
  local_2a8 = auVar177._0_2_;
  uStack_2a6 = auVar177._2_2_;
  uStack_2a4 = auVar177._4_2_;
  uStack_2a2 = auVar177._6_2_;
  uStack_2a0 = auVar177._8_2_;
  uStack_29e = auVar177._10_2_;
  uStack_29c = auVar177._12_2_;
  uStack_29a = auVar177._14_2_;
  auVar522._0_12_ = auVar403._0_12_;
  auVar522._12_2_ = auVar403._6_2_;
  auVar522._14_2_ = uStack_2a2;
  auVar521._12_4_ = auVar522._12_4_;
  auVar521._0_10_ = auVar403._0_10_;
  auVar521._10_2_ = uStack_2a4;
  auVar520._10_6_ = auVar521._10_6_;
  auVar520._0_8_ = auVar403._0_8_;
  auVar520._8_2_ = auVar403._4_2_;
  auVar519._8_8_ = auVar520._8_8_;
  auVar519._6_2_ = uStack_2a6;
  auVar519._4_2_ = auVar403._2_2_;
  auVar519._0_2_ = auVar403._0_2_;
  auVar519._2_2_ = local_2a8;
  auVar246._2_2_ = uStack_2a0;
  auVar246._0_2_ = auVar403._8_2_;
  auVar246._4_2_ = auVar403._10_2_;
  auVar246._6_2_ = uStack_29e;
  auVar246._8_2_ = auVar403._12_2_;
  auVar246._10_2_ = uStack_29c;
  auVar246._12_2_ = auVar403._14_2_;
  auVar246._14_2_ = uStack_29a;
  auVar248._8_4_ = 0xf138f9e1;
  auVar248._0_8_ = 0xf138f9e1f138f9e1;
  auVar248._12_4_ = 0xf138f9e1;
  auVar112 = pmaddwd(auVar519,auVar248);
  auVar177 = pmaddwd(auVar246,auVar248);
  auVar440._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar440._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar440._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar440._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar358._0_4_ = auVar177._0_4_ + 0x800 >> 0xc;
  auVar358._4_4_ = auVar177._4_4_ + 0x800 >> 0xc;
  auVar358._8_4_ = auVar177._8_4_ + 0x800 >> 0xc;
  auVar358._12_4_ = auVar177._12_4_ + 0x800 >> 0xc;
  auVar441 = packssdw(auVar440,auVar358);
  auVar112 = pmaddwd(auVar519,auVar34);
  auVar177 = pmaddwd(auVar246,auVar34);
  auVar523._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar523._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar523._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar523._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar148._0_4_ = auVar177._0_4_ + 0x800 >> 0xc;
  auVar148._4_4_ = auVar177._4_4_ + 0x800 >> 0xc;
  auVar148._8_4_ = auVar177._8_4_ + 0x800 >> 0xc;
  auVar148._12_4_ = auVar177._12_4_ + 0x800 >> 0xc;
  auVar524 = packssdw(auVar523,auVar148);
  auVar177 = paddsw(auVar316,auVar317);
  auVar518 = psubsw(auVar316,auVar317);
  auVar112 = paddsw(auVar457,auVar389);
  auVar372 = psubsw(auVar457,auVar389);
  auVar442 = psubsw(auVar431,auVar318);
  auVar114 = paddsw(auVar431,auVar318);
  auVar118 = psubsw(auVar391,auVar408);
  auVar431 = paddsw(auVar391,auVar408);
  auVar120 = paddsw(auVar198,auVar189);
  auVar198 = psubsw(auVar198,auVar189);
  auVar246 = paddsw(auVar325,auVar497);
  auVar391 = psubsw(auVar325,auVar497);
  auVar525 = psubsw(auVar195,auVar191);
  auVar252 = paddsw(auVar195,auVar191);
  auVar389 = psubsw(auVar466,auVar314);
  auVar122 = paddsw(auVar314,auVar466);
  local_428 = auVar315._0_2_;
  uStack_426 = auVar315._2_2_;
  uStack_424 = auVar315._4_2_;
  uStack_422 = auVar315._6_2_;
  uStack_420 = auVar315._8_2_;
  uStack_41e = auVar315._10_2_;
  uStack_41c = auVar315._12_2_;
  uStack_41a = auVar315._14_2_;
  auVar268._0_12_ = auVar250._0_12_;
  auVar268._12_2_ = auVar250._6_2_;
  auVar268._14_2_ = uStack_422;
  auVar267._12_4_ = auVar268._12_4_;
  auVar267._0_10_ = auVar250._0_10_;
  auVar267._10_2_ = uStack_424;
  auVar266._10_6_ = auVar267._10_6_;
  auVar266._0_8_ = auVar250._0_8_;
  auVar266._8_2_ = auVar250._4_2_;
  auVar265._8_8_ = auVar266._8_8_;
  auVar265._6_2_ = uStack_426;
  auVar265._4_2_ = auVar250._2_2_;
  auVar265._0_2_ = auVar250._0_2_;
  auVar265._2_2_ = local_428;
  auVar35._2_2_ = uStack_420;
  auVar35._0_2_ = auVar250._8_2_;
  auVar35._4_2_ = auVar250._10_2_;
  auVar35._6_2_ = uStack_41e;
  auVar35._8_2_ = auVar250._12_2_;
  auVar35._10_2_ = uStack_41c;
  auVar35._12_2_ = auVar250._14_2_;
  auVar35._14_2_ = uStack_41a;
  auVar314 = pmaddwd(auVar265,auVar319);
  auVar332 = pmaddwd(auVar35,auVar319);
  auVar326._0_4_ = auVar314._0_4_ + 0x800 >> 0xc;
  auVar326._4_4_ = auVar314._4_4_ + 0x800 >> 0xc;
  auVar326._8_4_ = auVar314._8_4_ + 0x800 >> 0xc;
  auVar326._12_4_ = auVar314._12_4_ + 0x800 >> 0xc;
  auVar250._0_4_ = auVar332._0_4_ + 0x800 >> 0xc;
  auVar250._4_4_ = auVar332._4_4_ + 0x800 >> 0xc;
  auVar250._8_4_ = auVar332._8_4_ + 0x800 >> 0xc;
  auVar250._12_4_ = auVar332._12_4_ + 0x800 >> 0xc;
  auVar408 = packssdw(auVar326,auVar250);
  auVar314 = pmaddwd(auVar265,auVar143);
  auVar332 = pmaddwd(auVar35,auVar143);
  auVar269._0_4_ = auVar314._0_4_ + 0x800 >> 0xc;
  auVar269._4_4_ = auVar314._4_4_ + 0x800 >> 0xc;
  auVar269._8_4_ = auVar314._8_4_ + 0x800 >> 0xc;
  auVar269._12_4_ = auVar314._12_4_ + 0x800 >> 0xc;
  auVar36._0_4_ = auVar332._0_4_ + 0x800 >> 0xc;
  auVar36._4_4_ = auVar332._4_4_ + 0x800 >> 0xc;
  auVar36._8_4_ = auVar332._8_4_ + 0x800 >> 0xc;
  auVar36._12_4_ = auVar332._12_4_ + 0x800 >> 0xc;
  auVar316 = packssdw(auVar269,auVar36);
  local_1a8 = auVar430._0_2_;
  uStack_1a6 = auVar430._2_2_;
  uStack_1a4 = auVar430._4_2_;
  uStack_1a2 = auVar430._6_2_;
  uStack_1a0 = auVar430._8_2_;
  uStack_19e = auVar430._10_2_;
  uStack_19c = auVar430._12_2_;
  uStack_19a = auVar430._14_2_;
  auVar40._0_12_ = auVar334._0_12_;
  auVar40._12_2_ = auVar334._6_2_;
  auVar40._14_2_ = uStack_1a2;
  auVar39._12_4_ = auVar40._12_4_;
  auVar39._0_10_ = auVar334._0_10_;
  auVar39._10_2_ = uStack_1a4;
  auVar38._10_6_ = auVar39._10_6_;
  auVar38._0_8_ = auVar334._0_8_;
  auVar38._8_2_ = auVar334._4_2_;
  auVar37._8_8_ = auVar38._8_8_;
  auVar37._6_2_ = uStack_1a6;
  auVar37._4_2_ = auVar334._2_2_;
  auVar37._0_2_ = auVar334._0_2_;
  auVar37._2_2_ = local_1a8;
  auVar270._2_2_ = uStack_1a0;
  auVar270._0_2_ = auVar334._8_2_;
  auVar270._4_2_ = auVar334._10_2_;
  auVar270._6_2_ = uStack_19e;
  auVar270._8_2_ = auVar334._12_2_;
  auVar270._10_2_ = uStack_19c;
  auVar270._12_2_ = auVar334._14_2_;
  auVar270._14_2_ = uStack_19a;
  auVar314 = pmaddwd(auVar37,auVar143);
  auVar334 = pmaddwd(auVar270,auVar143);
  auVar250 = pmaddwd(auVar37,auVar319);
  auVar332 = pmaddwd(auVar270,auVar319);
  auVar392._0_4_ = auVar250._0_4_ + 0x800 >> 0xc;
  auVar392._4_4_ = auVar250._4_4_ + 0x800 >> 0xc;
  auVar392._8_4_ = auVar250._8_4_ + 0x800 >> 0xc;
  auVar392._12_4_ = auVar250._12_4_ + 0x800 >> 0xc;
  auVar189._0_4_ = auVar332._0_4_ + 0x800 >> 0xc;
  auVar189._4_4_ = auVar332._4_4_ + 0x800 >> 0xc;
  auVar189._8_4_ = auVar332._8_4_ + 0x800 >> 0xc;
  auVar189._12_4_ = auVar332._12_4_ + 0x800 >> 0xc;
  auVar466 = packssdw(auVar392,auVar189);
  auVar41._0_4_ = auVar314._0_4_ + 0x800 >> 0xc;
  auVar41._4_4_ = auVar314._4_4_ + 0x800 >> 0xc;
  auVar41._8_4_ = auVar314._8_4_ + 0x800 >> 0xc;
  auVar41._12_4_ = auVar314._12_4_ + 0x800 >> 0xc;
  auVar271._0_4_ = auVar334._0_4_ + 0x800 >> 0xc;
  auVar271._4_4_ = auVar334._4_4_ + 0x800 >> 0xc;
  auVar271._8_4_ = auVar334._8_4_ + 0x800 >> 0xc;
  auVar271._12_4_ = auVar334._12_4_ + 0x800 >> 0xc;
  auVar334 = packssdw(auVar41,auVar271);
  local_348 = auVar387._0_2_;
  uStack_346 = auVar387._2_2_;
  uStack_344 = auVar387._4_2_;
  uStack_342 = auVar387._6_2_;
  uStack_340 = auVar387._8_2_;
  uStack_33e = auVar387._10_2_;
  uStack_33c = auVar387._12_2_;
  uStack_33a = auVar387._14_2_;
  auVar275._0_12_ = auVar377._0_12_;
  auVar275._12_2_ = auVar377._6_2_;
  auVar275._14_2_ = uStack_342;
  auVar274._12_4_ = auVar275._12_4_;
  auVar274._0_10_ = auVar377._0_10_;
  auVar274._10_2_ = uStack_344;
  auVar273._10_6_ = auVar274._10_6_;
  auVar273._0_8_ = auVar377._0_8_;
  auVar273._8_2_ = auVar377._4_2_;
  auVar272._8_8_ = auVar273._8_8_;
  auVar272._6_2_ = uStack_346;
  auVar272._4_2_ = auVar377._2_2_;
  auVar272._0_2_ = auVar377._0_2_;
  auVar272._2_2_ = local_348;
  auVar378._2_2_ = uStack_340;
  auVar378._0_2_ = auVar377._8_2_;
  auVar378._4_2_ = auVar377._10_2_;
  auVar378._6_2_ = uStack_33e;
  auVar378._8_2_ = auVar377._12_2_;
  auVar378._10_2_ = uStack_33c;
  auVar378._12_2_ = auVar377._14_2_;
  auVar378._14_2_ = uStack_33a;
  auVar314 = pmaddwd(auVar272,auVar291);
  auVar332 = pmaddwd(auVar378,auVar291);
  auVar42._0_4_ = auVar314._0_4_ + 0x800 >> 0xc;
  auVar42._4_4_ = auVar314._4_4_ + 0x800 >> 0xc;
  auVar42._8_4_ = auVar314._8_4_ + 0x800 >> 0xc;
  auVar42._12_4_ = auVar314._12_4_ + 0x800 >> 0xc;
  auVar191._0_4_ = auVar332._0_4_ + 0x800 >> 0xc;
  auVar191._4_4_ = auVar332._4_4_ + 0x800 >> 0xc;
  auVar191._8_4_ = auVar332._8_4_ + 0x800 >> 0xc;
  auVar191._12_4_ = auVar332._12_4_ + 0x800 >> 0xc;
  auVar250 = packssdw(auVar42,auVar191);
  auVar332 = pmaddwd(auVar272,auVar319);
  auVar314 = pmaddwd(auVar378,auVar319);
  auVar276._0_4_ = auVar332._0_4_ + 0x800 >> 0xc;
  auVar276._4_4_ = auVar332._4_4_ + 0x800 >> 0xc;
  auVar276._8_4_ = auVar332._8_4_ + 0x800 >> 0xc;
  auVar276._12_4_ = auVar332._12_4_ + 0x800 >> 0xc;
  auVar379._0_4_ = auVar314._0_4_ + 0x800 >> 0xc;
  auVar379._4_4_ = auVar314._4_4_ + 0x800 >> 0xc;
  auVar379._8_4_ = auVar314._8_4_ + 0x800 >> 0xc;
  auVar379._12_4_ = auVar314._12_4_ + 0x800 >> 0xc;
  auVar317 = packssdw(auVar276,auVar379);
  local_3e8 = auVar193._0_2_;
  uStack_3e6 = auVar193._2_2_;
  uStack_3e4 = auVar193._4_2_;
  uStack_3e2 = auVar193._6_2_;
  uStack_3e0 = auVar193._8_2_;
  uStack_3de = auVar193._10_2_;
  uStack_3dc = auVar193._12_2_;
  uStack_3da = auVar193._14_2_;
  auVar195._0_12_ = auVar338._0_12_;
  auVar195._12_2_ = auVar338._6_2_;
  auVar195._14_2_ = uStack_3e2;
  auVar197._12_4_ = auVar195._12_4_;
  auVar197._0_10_ = auVar338._0_10_;
  auVar197._10_2_ = uStack_3e4;
  auVar403._10_6_ = auVar197._10_6_;
  auVar403._0_8_ = auVar338._0_8_;
  auVar403._8_2_ = auVar338._4_2_;
  auVar193._8_8_ = auVar403._8_8_;
  auVar193._6_2_ = uStack_3e6;
  auVar193._4_2_ = auVar338._2_2_;
  auVar193._0_2_ = auVar338._0_2_;
  auVar193._2_2_ = local_3e8;
  auVar339._2_2_ = uStack_3e0;
  auVar339._0_2_ = auVar338._8_2_;
  auVar339._4_2_ = auVar338._10_2_;
  auVar339._6_2_ = uStack_3de;
  auVar339._8_2_ = auVar338._12_2_;
  auVar339._10_2_ = uStack_3dc;
  auVar339._12_2_ = auVar338._14_2_;
  auVar339._14_2_ = uStack_3da;
  auVar314 = pmaddwd(auVar193,auVar291);
  auVar191 = pmaddwd(auVar291,auVar339);
  auVar332 = pmaddwd(auVar193,auVar319);
  auVar189 = pmaddwd(auVar339,auVar319);
  auVar149._0_4_ = auVar314._0_4_ + 0x800 >> 0xc;
  auVar149._4_4_ = auVar314._4_4_ + 0x800 >> 0xc;
  auVar149._8_4_ = auVar314._8_4_ + 0x800 >> 0xc;
  auVar149._12_4_ = auVar314._12_4_ + 0x800 >> 0xc;
  auVar393._0_4_ = auVar191._0_4_ + 0x800 >> 0xc;
  auVar393._4_4_ = auVar191._4_4_ + 0x800 >> 0xc;
  auVar393._8_4_ = auVar191._8_4_ + 0x800 >> 0xc;
  auVar393._12_4_ = auVar191._12_4_ + 0x800 >> 0xc;
  auVar193 = packssdw(auVar149,auVar393);
  auVar457._0_4_ = auVar332._0_4_ + 0x800 >> 0xc;
  auVar457._4_4_ = auVar332._4_4_ + 0x800 >> 0xc;
  auVar457._8_4_ = auVar332._8_4_ + 0x800 >> 0xc;
  auVar457._12_4_ = auVar332._12_4_ + 0x800 >> 0xc;
  auVar340._0_4_ = auVar189._0_4_ + 0x800 >> 0xc;
  auVar340._4_4_ = auVar189._4_4_ + 0x800 >> 0xc;
  auVar340._8_4_ = auVar189._8_4_ + 0x800 >> 0xc;
  auVar340._12_4_ = auVar189._12_4_ + 0x800 >> 0xc;
  auVar332 = packssdw(auVar457,auVar340);
  local_1d8 = auVar373._0_2_;
  uStack_1d6 = auVar373._2_2_;
  uStack_1d4 = auVar373._4_2_;
  uStack_1d2 = auVar373._6_2_;
  uStack_1d0 = auVar373._8_2_;
  uStack_1ce = auVar373._10_2_;
  uStack_1cc = auVar373._12_2_;
  uStack_1ca = auVar373._14_2_;
  auVar280._0_12_ = auVar488._0_12_;
  auVar280._12_2_ = auVar488._6_2_;
  auVar280._14_2_ = uStack_1d2;
  auVar279._12_4_ = auVar280._12_4_;
  auVar279._0_10_ = auVar488._0_10_;
  auVar279._10_2_ = uStack_1d4;
  auVar278._10_6_ = auVar279._10_6_;
  auVar278._0_8_ = auVar488._0_8_;
  auVar278._8_2_ = auVar488._4_2_;
  auVar277._8_8_ = auVar278._8_8_;
  auVar277._6_2_ = uStack_1d6;
  auVar277._4_2_ = auVar488._2_2_;
  auVar277._0_2_ = auVar488._0_2_;
  auVar277._2_2_ = local_1d8;
  auVar43._2_2_ = uStack_1d0;
  auVar43._0_2_ = auVar488._8_2_;
  auVar43._4_2_ = auVar488._10_2_;
  auVar43._6_2_ = uStack_1ce;
  auVar43._8_2_ = auVar488._12_2_;
  auVar43._10_2_ = uStack_1cc;
  auVar43._12_2_ = auVar488._14_2_;
  auVar43._14_2_ = uStack_1ca;
  auVar189 = pmaddwd(auVar277,auVar292);
  auVar314 = pmaddwd(auVar43,auVar292);
  auVar150._0_4_ = auVar189._0_4_ + 0x800 >> 0xc;
  auVar150._4_4_ = auVar189._4_4_ + 0x800 >> 0xc;
  auVar150._8_4_ = auVar189._8_4_ + 0x800 >> 0xc;
  auVar150._12_4_ = auVar189._12_4_ + 0x800 >> 0xc;
  auVar488._0_4_ = auVar314._0_4_ + 0x800 >> 0xc;
  auVar488._4_4_ = auVar314._4_4_ + 0x800 >> 0xc;
  auVar488._8_4_ = auVar314._8_4_ + 0x800 >> 0xc;
  auVar488._12_4_ = auVar314._12_4_ + 0x800 >> 0xc;
  auVar195 = packssdw(auVar150,auVar488);
  auVar189 = pmaddwd(auVar277,auVar185);
  auVar314 = pmaddwd(auVar43,auVar185);
  auVar281._0_4_ = auVar189._0_4_ + 0x800 >> 0xc;
  auVar281._4_4_ = auVar189._4_4_ + 0x800 >> 0xc;
  auVar281._8_4_ = auVar189._8_4_ + 0x800 >> 0xc;
  auVar281._12_4_ = auVar189._12_4_ + 0x800 >> 0xc;
  auVar44._0_4_ = auVar314._0_4_ + 0x800 >> 0xc;
  auVar44._4_4_ = auVar314._4_4_ + 0x800 >> 0xc;
  auVar44._8_4_ = auVar314._8_4_ + 0x800 >> 0xc;
  auVar44._12_4_ = auVar314._12_4_ + 0x800 >> 0xc;
  auVar318 = packssdw(auVar281,auVar44);
  local_1e8 = auVar354._0_2_;
  uStack_1e6 = auVar354._2_2_;
  uStack_1e4 = auVar354._4_2_;
  uStack_1e2 = auVar354._6_2_;
  uStack_1e0 = auVar354._8_2_;
  uStack_1de = auVar354._10_2_;
  uStack_1dc = auVar354._12_2_;
  uStack_1da = auVar354._14_2_;
  auVar470._0_12_ = auVar513._0_12_;
  auVar470._12_2_ = auVar513._6_2_;
  auVar470._14_2_ = uStack_1e2;
  auVar469._12_4_ = auVar470._12_4_;
  auVar469._0_10_ = auVar513._0_10_;
  auVar469._10_2_ = uStack_1e4;
  auVar468._10_6_ = auVar469._10_6_;
  auVar468._0_8_ = auVar513._0_8_;
  auVar468._8_2_ = auVar513._4_2_;
  auVar467._8_8_ = auVar468._8_8_;
  auVar467._6_2_ = uStack_1e6;
  auVar467._4_2_ = auVar513._2_2_;
  auVar467._0_2_ = auVar513._0_2_;
  auVar467._2_2_ = local_1e8;
  auVar45._2_2_ = uStack_1e0;
  auVar45._0_2_ = auVar513._8_2_;
  auVar45._4_2_ = auVar513._10_2_;
  auVar45._6_2_ = uStack_1de;
  auVar45._8_2_ = auVar513._12_2_;
  auVar45._10_2_ = uStack_1dc;
  auVar45._12_2_ = auVar513._14_2_;
  auVar45._14_2_ = uStack_1da;
  auVar191 = pmaddwd(auVar467,auVar185);
  auVar314 = pmaddwd(auVar45,auVar185);
  auVar189 = pmaddwd(auVar467,auVar292);
  auVar185 = pmaddwd(auVar45,auVar292);
  auVar282._0_4_ = auVar189._0_4_ + 0x800 >> 0xc;
  auVar282._4_4_ = auVar189._4_4_ + 0x800 >> 0xc;
  auVar282._8_4_ = auVar189._8_4_ + 0x800 >> 0xc;
  auVar282._12_4_ = auVar189._12_4_ + 0x800 >> 0xc;
  auVar513._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar513._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar513._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar513._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar325 = packssdw(auVar282,auVar513);
  auVar471._0_4_ = auVar191._0_4_ + 0x800 >> 0xc;
  auVar471._4_4_ = auVar191._4_4_ + 0x800 >> 0xc;
  auVar471._8_4_ = auVar191._8_4_ + 0x800 >> 0xc;
  auVar471._12_4_ = auVar191._12_4_ + 0x800 >> 0xc;
  auVar46._0_4_ = auVar314._0_4_ + 0x800 >> 0xc;
  auVar46._4_4_ = auVar314._4_4_ + 0x800 >> 0xc;
  auVar46._8_4_ = auVar314._8_4_ + 0x800 >> 0xc;
  auVar46._12_4_ = auVar314._12_4_ + 0x800 >> 0xc;
  auVar377 = packssdw(auVar471,auVar46);
  local_448 = auVar288._0_2_;
  uStack_446 = auVar288._2_2_;
  uStack_444 = auVar288._4_2_;
  uStack_442 = auVar288._6_2_;
  uStack_440 = auVar288._8_2_;
  uStack_43e = auVar288._10_2_;
  uStack_43c = auVar288._12_2_;
  uStack_43a = auVar288._14_2_;
  auVar154._0_12_ = auVar514._0_12_;
  auVar154._12_2_ = auVar514._6_2_;
  auVar154._14_2_ = uStack_442;
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._0_10_ = auVar514._0_10_;
  auVar153._10_2_ = uStack_444;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._0_8_ = auVar514._0_8_;
  auVar152._8_2_ = auVar514._4_2_;
  auVar151._8_8_ = auVar152._8_8_;
  auVar151._6_2_ = uStack_446;
  auVar151._4_2_ = auVar514._2_2_;
  auVar151._0_2_ = auVar514._0_2_;
  auVar151._2_2_ = local_448;
  auVar293._2_2_ = uStack_440;
  auVar293._0_2_ = auVar514._8_2_;
  auVar293._4_2_ = auVar514._10_2_;
  auVar293._6_2_ = uStack_43e;
  auVar293._8_2_ = auVar514._12_2_;
  auVar293._10_2_ = uStack_43c;
  auVar293._12_2_ = auVar514._14_2_;
  auVar293._14_2_ = uStack_43a;
  auVar314 = pmaddwd(auVar151,auVar187);
  auVar185 = pmaddwd(auVar293,auVar187);
  auVar47._0_4_ = auVar314._0_4_ + 0x800 >> 0xc;
  auVar47._4_4_ = auVar314._4_4_ + 0x800 >> 0xc;
  auVar47._8_4_ = auVar314._8_4_ + 0x800 >> 0xc;
  auVar47._12_4_ = auVar314._12_4_ + 0x800 >> 0xc;
  auVar288._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar288._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar288._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar288._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar314 = packssdw(auVar47,auVar288);
  auVar185 = pmaddwd(auVar151,auVar292);
  auVar189 = pmaddwd(auVar293,auVar292);
  auVar155._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar155._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar155._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar155._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar294._0_4_ = auVar189._0_4_ + 0x800 >> 0xc;
  auVar294._4_4_ = auVar189._4_4_ + 0x800 >> 0xc;
  auVar294._8_4_ = auVar189._8_4_ + 0x800 >> 0xc;
  auVar294._12_4_ = auVar189._12_4_ + 0x800 >> 0xc;
  auVar197 = packssdw(auVar155,auVar294);
  local_498 = auVar335._0_2_;
  uStack_496 = auVar335._2_2_;
  uStack_494 = auVar335._4_2_;
  uStack_492 = auVar335._6_2_;
  uStack_490 = auVar335._8_2_;
  uStack_48e = auVar335._10_2_;
  uStack_48c = auVar335._12_2_;
  uStack_48a = auVar335._14_2_;
  auVar387._0_12_ = auVar98._0_12_;
  auVar387._12_2_ = auVar98._6_2_;
  auVar387._14_2_ = uStack_492;
  auVar373._12_4_ = auVar387._12_4_;
  auVar373._0_10_ = auVar98._0_10_;
  auVar373._10_2_ = uStack_494;
  auVar354._10_6_ = auVar373._10_6_;
  auVar354._0_8_ = auVar98._0_8_;
  auVar354._8_2_ = auVar98._4_2_;
  auVar335._8_8_ = auVar354._8_8_;
  auVar335._6_2_ = uStack_496;
  auVar335._4_2_ = auVar98._2_2_;
  auVar335._0_2_ = auVar98._0_2_;
  auVar335._2_2_ = local_498;
  auVar295._2_2_ = uStack_490;
  auVar295._0_2_ = auVar98._8_2_;
  auVar295._4_2_ = auVar98._10_2_;
  auVar295._6_2_ = uStack_48e;
  auVar295._8_2_ = auVar98._12_2_;
  auVar295._10_2_ = uStack_48c;
  auVar295._12_2_ = auVar98._14_2_;
  auVar295._14_2_ = uStack_48a;
  auVar189 = pmaddwd(auVar335,auVar187);
  auVar185 = pmaddwd(auVar187,auVar295);
  auVar98 = pmaddwd(auVar335,auVar292);
  auVar187 = pmaddwd(auVar295,auVar292);
  auVar359._0_4_ = auVar189._0_4_ + 0x800 >> 0xc;
  auVar359._4_4_ = auVar189._4_4_ + 0x800 >> 0xc;
  auVar359._8_4_ = auVar189._8_4_ + 0x800 >> 0xc;
  auVar359._12_4_ = auVar189._12_4_ + 0x800 >> 0xc;
  auVar283._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar283._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar283._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar283._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar338 = packssdw(auVar359,auVar283);
  auVar430._0_4_ = auVar98._0_4_ + 0x800 >> 0xc;
  auVar430._4_4_ = auVar98._4_4_ + 0x800 >> 0xc;
  auVar430._8_4_ = auVar98._8_4_ + 0x800 >> 0xc;
  auVar430._12_4_ = auVar98._12_4_ + 0x800 >> 0xc;
  auVar296._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar296._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar296._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar296._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar98 = packssdw(auVar430,auVar296);
  auVar185 = pshuflw(ZEXT416(0x5a80),ZEXT416(0x5a80),0);
  auVar315._0_4_ = auVar185._0_4_;
  auVar315._4_4_ = auVar315._0_4_;
  auVar315._8_4_ = auVar315._0_4_;
  auVar315._12_4_ = auVar315._0_4_;
  auVar185 = pmulhrsw(auVar315,(undefined1  [16])*input);
  auVar403 = paddsw(auVar185,auVar204);
  auVar457 = psubsw(auVar185,auVar204);
  auVar488 = paddsw(auVar185,auVar181);
  auVar181 = psubsw(auVar185,auVar181);
  local_a8 = auVar388._0_2_;
  uStack_a6 = auVar388._2_2_;
  uStack_a4 = auVar388._4_2_;
  uStack_a2 = auVar388._6_2_;
  uStack_a0 = auVar388._8_2_;
  uStack_9e = auVar388._10_2_;
  uStack_9c = auVar388._12_2_;
  uStack_9a = auVar388._14_2_;
  auVar159._0_12_ = auVar489._0_12_;
  auVar159._12_2_ = auVar489._6_2_;
  auVar159._14_2_ = uStack_a2;
  auVar158._12_4_ = auVar159._12_4_;
  auVar158._0_10_ = auVar489._0_10_;
  auVar158._10_2_ = uStack_a4;
  auVar157._10_6_ = auVar158._10_6_;
  auVar157._0_8_ = auVar489._0_8_;
  auVar157._8_2_ = auVar489._4_2_;
  auVar156._8_8_ = auVar157._8_8_;
  auVar156._6_2_ = uStack_a6;
  auVar156._4_2_ = auVar489._2_2_;
  auVar156._0_2_ = auVar489._0_2_;
  auVar156._2_2_ = local_a8;
  auVar204._2_2_ = uStack_a0;
  auVar204._0_2_ = auVar489._8_2_;
  auVar204._4_2_ = auVar489._10_2_;
  auVar204._6_2_ = uStack_9e;
  auVar204._8_2_ = auVar489._12_2_;
  auVar204._10_2_ = uStack_9c;
  auVar204._12_2_ = auVar489._14_2_;
  auVar204._14_2_ = uStack_9a;
  auVar284._8_4_ = 0xb50f4b0;
  auVar284._0_8_ = 0xb50f4b00b50f4b0;
  auVar284._12_4_ = 0xb50f4b0;
  auVar187 = pmaddwd(auVar156,auVar284);
  auVar185 = pmaddwd(auVar204,auVar284);
  auVar394._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar394._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar394._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar394._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar48._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar48._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar48._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar48._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar497 = packssdw(auVar394,auVar48);
  auVar49._8_4_ = 0xb500b50;
  auVar49._0_8_ = 0xb500b500b500b50;
  auVar49._12_4_ = 0xb500b50;
  auVar187 = pmaddwd(auVar156,auVar49);
  auVar185 = pmaddwd(auVar204,auVar49);
  auVar160._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar160._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar160._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar160._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar489._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar489._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar489._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar489._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar513 = packssdw(auVar160,auVar489);
  auVar335 = paddsw(auVar404,auVar104);
  auVar187 = psubsw(auVar404,auVar104);
  auVar189 = paddsw(auVar116,auVar441);
  auVar104 = psubsw(auVar116,auVar441);
  auVar354 = psubsw(auVar96,auVar458);
  auVar116 = paddsw(auVar96,auVar458);
  auVar191 = psubsw(auVar439,auVar524);
  auVar96 = paddsw(auVar524,auVar439);
  auVar501._0_12_ = auVar372._0_12_;
  auVar501._12_2_ = auVar372._6_2_;
  auVar501._14_2_ = auVar389._6_2_;
  auVar500._12_4_ = auVar501._12_4_;
  auVar500._0_10_ = auVar372._0_10_;
  auVar500._10_2_ = auVar389._4_2_;
  auVar499._10_6_ = auVar500._10_6_;
  auVar499._0_8_ = auVar372._0_8_;
  auVar499._8_2_ = auVar372._4_2_;
  auVar498._8_8_ = auVar499._8_8_;
  auVar498._6_2_ = auVar389._2_2_;
  auVar498._4_2_ = auVar372._2_2_;
  auVar498._0_2_ = auVar372._0_2_;
  auVar498._2_2_ = auVar389._0_2_;
  auVar404._2_2_ = auVar389._8_2_;
  auVar404._0_2_ = auVar372._8_2_;
  auVar404._4_2_ = auVar372._10_2_;
  auVar404._6_2_ = auVar389._10_2_;
  auVar404._8_2_ = auVar372._12_2_;
  auVar404._10_2_ = auVar389._12_2_;
  auVar404._12_2_ = auVar372._14_2_;
  auVar404._14_2_ = auVar389._14_2_;
  auVar372 = pmaddwd(auVar498,auVar34);
  auVar185 = pmaddwd(auVar404,auVar34);
  auVar221._0_4_ = auVar372._0_4_ + 0x800 >> 0xc;
  auVar221._4_4_ = auVar372._4_4_ + 0x800 >> 0xc;
  auVar221._8_4_ = auVar372._8_4_ + 0x800 >> 0xc;
  auVar221._12_4_ = auVar372._12_4_ + 0x800 >> 0xc;
  auVar50._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar50._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar50._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar50._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar372 = packssdw(auVar221,auVar50);
  auVar288 = pmaddwd(auVar498,auVar244);
  auVar185 = pmaddwd(auVar404,auVar244);
  auVar502._0_4_ = auVar288._0_4_ + 0x800 >> 0xc;
  auVar502._4_4_ = auVar288._4_4_ + 0x800 >> 0xc;
  auVar502._8_4_ = auVar288._8_4_ + 0x800 >> 0xc;
  auVar502._12_4_ = auVar288._12_4_ + 0x800 >> 0xc;
  auVar285._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar285._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar285._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar285._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar503 = packssdw(auVar502,auVar285);
  auVar300._0_12_ = auVar518._0_12_;
  auVar300._12_2_ = auVar518._6_2_;
  auVar300._14_2_ = auVar525._6_2_;
  auVar299._12_4_ = auVar300._12_4_;
  auVar299._0_10_ = auVar518._0_10_;
  auVar299._10_2_ = auVar525._4_2_;
  auVar298._10_6_ = auVar299._10_6_;
  auVar298._0_8_ = auVar518._0_8_;
  auVar298._8_2_ = auVar518._4_2_;
  auVar297._8_8_ = auVar298._8_8_;
  auVar297._6_2_ = auVar525._2_2_;
  auVar297._4_2_ = auVar518._2_2_;
  auVar297._0_2_ = auVar518._0_2_;
  auVar297._2_2_ = auVar525._0_2_;
  auVar341._2_2_ = auVar525._8_2_;
  auVar341._0_2_ = auVar518._8_2_;
  auVar341._4_2_ = auVar518._10_2_;
  auVar341._6_2_ = auVar525._10_2_;
  auVar341._8_2_ = auVar518._12_2_;
  auVar341._10_2_ = auVar525._12_2_;
  auVar341._12_2_ = auVar518._14_2_;
  auVar341._14_2_ = auVar525._14_2_;
  auVar288 = pmaddwd(auVar297,auVar34);
  auVar185 = pmaddwd(auVar341,auVar34);
  auVar526._0_4_ = auVar288._0_4_ + 0x800 >> 0xc;
  auVar526._4_4_ = auVar288._4_4_ + 0x800 >> 0xc;
  auVar526._8_4_ = auVar288._8_4_ + 0x800 >> 0xc;
  auVar526._12_4_ = auVar288._12_4_ + 0x800 >> 0xc;
  auVar51._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar51._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar51._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar51._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar518 = packssdw(auVar526,auVar51);
  auVar185 = pmaddwd(auVar297,auVar244);
  auVar288 = pmaddwd(auVar341,auVar244);
  auVar301._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar301._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar301._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar301._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar342._0_4_ = auVar288._0_4_ + 0x800 >> 0xc;
  auVar342._4_4_ = auVar288._4_4_ + 0x800 >> 0xc;
  auVar342._8_4_ = auVar288._8_4_ + 0x800 >> 0xc;
  auVar342._12_4_ = auVar288._12_4_ + 0x800 >> 0xc;
  auVar373 = packssdw(auVar301,auVar342);
  local_358 = auVar198._0_2_;
  uStack_356 = auVar198._2_2_;
  uStack_354 = auVar198._4_2_;
  uStack_352 = auVar198._6_2_;
  uStack_350 = auVar198._8_2_;
  uStack_34e = auVar198._10_2_;
  uStack_34c = auVar198._12_2_;
  uStack_34a = auVar198._14_2_;
  auVar198._0_12_ = auVar442._0_12_;
  auVar198._12_2_ = auVar442._6_2_;
  auVar198._14_2_ = uStack_352;
  auVar389._12_4_ = auVar198._12_4_;
  auVar389._0_10_ = auVar442._0_10_;
  auVar389._10_2_ = uStack_354;
  auVar458._10_6_ = auVar389._10_6_;
  auVar458._0_8_ = auVar442._0_8_;
  auVar458._8_2_ = auVar442._4_2_;
  auVar388._8_8_ = auVar458._8_8_;
  auVar388._6_2_ = uStack_356;
  auVar388._4_2_ = auVar442._2_2_;
  auVar388._0_2_ = auVar442._0_2_;
  auVar388._2_2_ = local_358;
  auVar443._2_2_ = uStack_350;
  auVar443._0_2_ = auVar442._8_2_;
  auVar443._4_2_ = auVar442._10_2_;
  auVar443._6_2_ = uStack_34e;
  auVar443._8_2_ = auVar442._12_2_;
  auVar443._10_2_ = uStack_34c;
  auVar443._12_2_ = auVar442._14_2_;
  auVar443._14_2_ = uStack_34a;
  auVar185 = pmaddwd(auVar388,auVar248);
  auVar288 = pmaddwd(auVar443,auVar248);
  auVar222._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar222._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar222._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar222._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar343._0_4_ = auVar288._0_4_ + 0x800 >> 0xc;
  auVar343._4_4_ = auVar288._4_4_ + 0x800 >> 0xc;
  auVar343._8_4_ = auVar288._8_4_ + 0x800 >> 0xc;
  auVar343._12_4_ = auVar288._12_4_ + 0x800 >> 0xc;
  auVar288 = packssdw(auVar222,auVar343);
  auVar185 = pmaddwd(auVar388,auVar34);
  auVar387 = pmaddwd(auVar443,auVar34);
  auVar514._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar514._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar514._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar514._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar444._0_4_ = auVar387._0_4_ + 0x800 >> 0xc;
  auVar444._4_4_ = auVar387._4_4_ + 0x800 >> 0xc;
  auVar444._8_4_ = auVar387._8_4_ + 0x800 >> 0xc;
  auVar444._12_4_ = auVar387._12_4_ + 0x800 >> 0xc;
  auVar185 = packssdw(auVar514,auVar444);
  local_178 = auVar391._0_2_;
  uStack_176 = auVar391._2_2_;
  uStack_174 = auVar391._4_2_;
  uStack_172 = auVar391._6_2_;
  uStack_170 = auVar391._8_2_;
  uStack_16e = auVar391._10_2_;
  uStack_16c = auVar391._12_2_;
  uStack_16a = auVar391._14_2_;
  auVar448._0_12_ = auVar118._0_12_;
  auVar448._12_2_ = auVar118._6_2_;
  auVar448._14_2_ = uStack_172;
  auVar447._12_4_ = auVar448._12_4_;
  auVar447._0_10_ = auVar118._0_10_;
  auVar447._10_2_ = uStack_174;
  auVar446._10_6_ = auVar447._10_6_;
  auVar446._0_8_ = auVar118._0_8_;
  auVar446._8_2_ = auVar118._4_2_;
  auVar445._8_8_ = auVar446._8_8_;
  auVar445._6_2_ = uStack_176;
  auVar445._4_2_ = auVar118._2_2_;
  auVar445._0_2_ = auVar118._0_2_;
  auVar445._2_2_ = local_178;
  auVar286._2_2_ = uStack_170;
  auVar286._0_2_ = auVar118._8_2_;
  auVar286._4_2_ = auVar118._10_2_;
  auVar286._6_2_ = uStack_16e;
  auVar286._8_2_ = auVar118._12_2_;
  auVar286._10_2_ = uStack_16c;
  auVar286._12_2_ = auVar118._14_2_;
  auVar286._14_2_ = uStack_16a;
  auVar118 = pmaddwd(auVar445,auVar248);
  auVar387 = pmaddwd(auVar286,auVar248);
  auVar52._0_4_ = auVar118._0_4_ + 0x800 >> 0xc;
  auVar52._4_4_ = auVar118._4_4_ + 0x800 >> 0xc;
  auVar52._8_4_ = auVar118._8_4_ + 0x800 >> 0xc;
  auVar52._12_4_ = auVar118._12_4_ + 0x800 >> 0xc;
  auVar344._0_4_ = auVar387._0_4_ + 0x800 >> 0xc;
  auVar344._4_4_ = auVar387._4_4_ + 0x800 >> 0xc;
  auVar344._8_4_ = auVar387._8_4_ + 0x800 >> 0xc;
  auVar344._12_4_ = auVar387._12_4_ + 0x800 >> 0xc;
  auVar118 = packssdw(auVar52,auVar344);
  auVar430 = pmaddwd(auVar445,auVar34);
  auVar387 = pmaddwd(auVar286,auVar34);
  auVar449._0_4_ = auVar430._0_4_ + 0x800 >> 0xc;
  auVar449._4_4_ = auVar430._4_4_ + 0x800 >> 0xc;
  auVar449._8_4_ = auVar430._8_4_ + 0x800 >> 0xc;
  auVar449._12_4_ = auVar430._12_4_ + 0x800 >> 0xc;
  auVar409._0_4_ = auVar387._0_4_ + 0x800 >> 0xc;
  auVar409._4_4_ = auVar387._4_4_ + 0x800 >> 0xc;
  auVar409._8_4_ = auVar387._8_4_ + 0x800 >> 0xc;
  auVar409._12_4_ = auVar387._12_4_ + 0x800 >> 0xc;
  auVar391 = packssdw(auVar449,auVar409);
  auVar387 = paddsw(auVar102,auVar2);
  auVar489 = psubsw(auVar102,auVar2);
  auVar2 = paddsw(auVar242,auVar312);
  auVar430 = psubsw(auVar242,auVar312);
  auVar315 = paddsw(auVar408,auVar193);
  auVar242 = psubsw(auVar408,auVar193);
  auVar312 = paddsw(auVar466,auVar250);
  auVar250 = psubsw(auVar466,auVar250);
  auVar204 = psubsw(auVar7,auVar97);
  auVar404 = paddsw(auVar7,auVar97);
  auVar458 = psubsw(auVar433,auVar3);
  auVar410 = paddsw(auVar433,auVar3);
  auVar97 = psubsw(auVar338,auVar195);
  auVar389 = paddsw(auVar338,auVar195);
  auVar388 = psubsw(auVar314,auVar325);
  auVar3 = paddsw(auVar314,auVar325);
  auVar411 = paddsw(auVar110,auVar106);
  auVar198 = psubsw(auVar110,auVar106);
  auVar412 = paddsw(auVar179,auVar108);
  auVar514 = psubsw(auVar179,auVar108);
  auVar439 = paddsw(auVar98,auVar318);
  auVar7 = psubsw(auVar98,auVar318);
  auVar441 = paddsw(auVar197,auVar377);
  auVar98 = psubsw(auVar197,auVar377);
  auVar195 = psubsw(auVar4,auVar6);
  auVar442 = paddsw(auVar4,auVar6);
  auVar193 = psubsw(auVar5,auVar100);
  auVar524 = paddsw(auVar5,auVar100);
  auVar197 = psubsw(auVar316,auVar332);
  auVar110 = paddsw(auVar332,auVar316);
  auVar316 = psubsw(auVar334,auVar317);
  auVar179 = paddsw(auVar317,auVar334);
  auVar472 = paddsw(auVar403,auVar124);
  auVar106 = psubsw(auVar403,auVar124);
  auVar377 = paddsw(auVar488,auVar513);
  auVar108 = psubsw(auVar488,auVar513);
  auVar332 = paddsw(auVar181,auVar497);
  auVar6 = psubsw(auVar181,auVar497);
  auVar488 = paddsw(auVar457,auVar183);
  auVar314 = psubsw(auVar457,auVar183);
  local_1c8 = auVar191._0_2_;
  uStack_1c6 = auVar191._2_2_;
  uStack_1c4 = auVar191._4_2_;
  uStack_1c2 = auVar191._6_2_;
  uStack_1c0 = auVar191._8_2_;
  uStack_1be = auVar191._10_2_;
  uStack_1bc = auVar191._12_2_;
  uStack_1ba = auVar191._14_2_;
  auVar416._0_12_ = auVar104._0_12_;
  auVar416._12_2_ = auVar104._6_2_;
  auVar416._14_2_ = uStack_1c2;
  auVar415._12_4_ = auVar416._12_4_;
  auVar415._0_10_ = auVar104._0_10_;
  auVar415._10_2_ = uStack_1c4;
  auVar414._10_6_ = auVar415._10_6_;
  auVar414._0_8_ = auVar104._0_8_;
  auVar414._8_2_ = auVar104._4_2_;
  auVar413._8_8_ = auVar414._8_8_;
  auVar413._6_2_ = uStack_1c6;
  auVar413._4_2_ = auVar104._2_2_;
  auVar413._0_2_ = auVar104._0_2_;
  auVar413._2_2_ = local_1c8;
  auVar161._2_2_ = uStack_1c0;
  auVar161._0_2_ = auVar104._8_2_;
  auVar161._4_2_ = auVar104._10_2_;
  auVar161._6_2_ = uStack_1be;
  auVar161._8_2_ = auVar104._12_2_;
  auVar161._10_2_ = uStack_1bc;
  auVar161._12_2_ = auVar104._14_2_;
  auVar161._14_2_ = uStack_1ba;
  auVar4 = pmaddwd(auVar413,auVar284);
  auVar100 = pmaddwd(auVar161,auVar284);
  auVar360._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar360._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar360._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar360._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar4._0_4_ = auVar100._0_4_ + 0x800 >> 0xc;
  auVar4._4_4_ = auVar100._4_4_ + 0x800 >> 0xc;
  auVar4._8_4_ = auVar100._8_4_ + 0x800 >> 0xc;
  auVar4._12_4_ = auVar100._12_4_ + 0x800 >> 0xc;
  auVar513 = packssdw(auVar360,auVar4);
  auVar4 = pmaddwd(auVar413,auVar49);
  auVar100 = pmaddwd(auVar161,auVar49);
  auVar417._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar417._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar417._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar417._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar162._0_4_ = auVar100._0_4_ + 0x800 >> 0xc;
  auVar162._4_4_ = auVar100._4_4_ + 0x800 >> 0xc;
  auVar162._8_4_ = auVar100._8_4_ + 0x800 >> 0xc;
  auVar162._12_4_ = auVar100._12_4_ + 0x800 >> 0xc;
  auVar466 = packssdw(auVar417,auVar162);
  local_498 = auVar354._0_2_;
  uStack_496 = auVar354._2_2_;
  uStack_494 = auVar354._4_2_;
  uStack_492 = auVar354._6_2_;
  uStack_490 = auVar354._8_2_;
  uStack_48e = auVar354._10_2_;
  uStack_48c = auVar354._12_2_;
  uStack_48a = auVar354._14_2_;
  auVar421._0_12_ = auVar187._0_12_;
  auVar421._12_2_ = auVar187._6_2_;
  auVar421._14_2_ = uStack_492;
  auVar420._12_4_ = auVar421._12_4_;
  auVar420._0_10_ = auVar187._0_10_;
  auVar420._10_2_ = uStack_494;
  auVar419._10_6_ = auVar420._10_6_;
  auVar419._0_8_ = auVar187._0_8_;
  auVar419._8_2_ = auVar187._4_2_;
  auVar418._8_8_ = auVar419._8_8_;
  auVar418._6_2_ = uStack_496;
  auVar418._4_2_ = auVar187._2_2_;
  auVar418._0_2_ = auVar187._0_2_;
  auVar418._2_2_ = local_498;
  auVar163._2_2_ = uStack_490;
  auVar163._0_2_ = auVar187._8_2_;
  auVar163._4_2_ = auVar187._10_2_;
  auVar163._6_2_ = uStack_48e;
  auVar163._8_2_ = auVar187._12_2_;
  auVar163._10_2_ = uStack_48c;
  auVar163._12_2_ = auVar187._14_2_;
  auVar163._14_2_ = uStack_48a;
  auVar4 = pmaddwd(auVar418,auVar284);
  auVar100 = pmaddwd(auVar163,auVar284);
  auVar473._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar473._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar473._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar473._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar5._0_4_ = auVar100._0_4_ + 0x800 >> 0xc;
  auVar5._4_4_ = auVar100._4_4_ + 0x800 >> 0xc;
  auVar5._8_4_ = auVar100._8_4_ + 0x800 >> 0xc;
  auVar5._12_4_ = auVar100._12_4_ + 0x800 >> 0xc;
  auVar474 = packssdw(auVar473,auVar5);
  auVar4 = pmaddwd(auVar418,auVar49);
  auVar100 = pmaddwd(auVar163,auVar49);
  auVar422._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar422._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar422._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar422._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar164._0_4_ = auVar100._0_4_ + 0x800 >> 0xc;
  auVar164._4_4_ = auVar100._4_4_ + 0x800 >> 0xc;
  auVar164._8_4_ = auVar100._8_4_ + 0x800 >> 0xc;
  auVar164._12_4_ = auVar100._12_4_ + 0x800 >> 0xc;
  auVar433 = packssdw(auVar422,auVar164);
  auVar525 = paddsw(auVar177,auVar114);
  auVar100 = psubsw(auVar177,auVar114);
  auVar395 = paddsw(auVar112,auVar431);
  auVar4 = psubsw(auVar112,auVar431);
  auVar5 = paddsw(auVar372,auVar118);
  auVar334 = psubsw(auVar372,auVar118);
  auVar102 = paddsw(auVar518,auVar288);
  auVar431 = psubsw(auVar518,auVar288);
  auVar497 = psubsw(auVar252,auVar120);
  auVar104 = paddsw(auVar252,auVar120);
  auVar288 = psubsw(auVar122,auVar246);
  auVar177 = paddsw(auVar122,auVar246);
  auVar124 = psubsw(auVar503,auVar391);
  auVar181 = paddsw(auVar391,auVar503);
  auVar187 = psubsw(auVar373,auVar185);
  auVar183 = paddsw(auVar185,auVar373);
  auVar56._0_12_ = auVar250._0_12_;
  auVar56._12_2_ = auVar250._6_2_;
  auVar56._14_2_ = auVar316._6_2_;
  auVar55._12_4_ = auVar56._12_4_;
  auVar55._0_10_ = auVar250._0_10_;
  auVar55._10_2_ = auVar316._4_2_;
  auVar54._10_6_ = auVar55._10_6_;
  auVar54._0_8_ = auVar250._0_8_;
  auVar54._8_2_ = auVar250._4_2_;
  auVar53._8_8_ = auVar54._8_8_;
  auVar53._6_2_ = auVar316._2_2_;
  auVar53._4_2_ = auVar250._2_2_;
  auVar53._0_2_ = auVar250._0_2_;
  auVar53._2_2_ = auVar316._0_2_;
  auVar302._2_2_ = auVar316._8_2_;
  auVar302._0_2_ = auVar250._8_2_;
  auVar302._4_2_ = auVar250._10_2_;
  auVar302._6_2_ = auVar316._10_2_;
  auVar302._8_2_ = auVar250._12_2_;
  auVar302._10_2_ = auVar316._12_2_;
  auVar302._12_2_ = auVar250._14_2_;
  auVar302._14_2_ = auVar316._14_2_;
  auVar112 = pmaddwd(auVar53,auVar34);
  auVar185 = pmaddwd(auVar302,auVar34);
  auVar223._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar223._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar223._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar223._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar316._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar316._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar316._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar316._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar372 = packssdw(auVar223,auVar316);
  auVar185 = pmaddwd(auVar53,auVar244);
  auVar112 = pmaddwd(auVar302,auVar244);
  auVar57._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar57._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar57._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar57._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar303._0_4_ = auVar112._0_4_ + 0x800 >> 0xc;
  auVar303._4_4_ = auVar112._4_4_ + 0x800 >> 0xc;
  auVar303._8_4_ = auVar112._8_4_ + 0x800 >> 0xc;
  auVar303._12_4_ = auVar112._12_4_ + 0x800 >> 0xc;
  auVar112 = packssdw(auVar57,auVar303);
  local_1e8 = auVar197._0_2_;
  uStack_1e6 = auVar197._2_2_;
  uStack_1e4 = auVar197._4_2_;
  uStack_1e2 = auVar197._6_2_;
  uStack_1e0 = auVar197._8_2_;
  uStack_1de = auVar197._10_2_;
  uStack_1dc = auVar197._12_2_;
  uStack_1da = auVar197._14_2_;
  auVar227._0_12_ = auVar242._0_12_;
  auVar227._12_2_ = auVar242._6_2_;
  auVar227._14_2_ = uStack_1e2;
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._0_10_ = auVar242._0_10_;
  auVar226._10_2_ = uStack_1e4;
  auVar225._10_6_ = auVar226._10_6_;
  auVar225._0_8_ = auVar242._0_8_;
  auVar225._8_2_ = auVar242._4_2_;
  auVar224._8_8_ = auVar225._8_8_;
  auVar224._6_2_ = uStack_1e6;
  auVar224._4_2_ = auVar242._2_2_;
  auVar224._0_2_ = auVar242._0_2_;
  auVar224._2_2_ = local_1e8;
  auVar58._2_2_ = uStack_1e0;
  auVar58._0_2_ = auVar242._8_2_;
  auVar58._4_2_ = auVar242._10_2_;
  auVar58._6_2_ = uStack_1de;
  auVar58._8_2_ = auVar242._12_2_;
  auVar58._10_2_ = uStack_1dc;
  auVar58._12_2_ = auVar242._14_2_;
  auVar58._14_2_ = uStack_1da;
  auVar185 = pmaddwd(auVar224,auVar34);
  auVar242 = pmaddwd(auVar58,auVar34);
  auVar304._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar304._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar304._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar304._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar317._0_4_ = auVar242._0_4_ + 0x800 >> 0xc;
  auVar317._4_4_ = auVar242._4_4_ + 0x800 >> 0xc;
  auVar317._8_4_ = auVar242._8_4_ + 0x800 >> 0xc;
  auVar317._12_4_ = auVar242._12_4_ + 0x800 >> 0xc;
  auVar246 = packssdw(auVar304,auVar317);
  auVar185 = pmaddwd(auVar224,auVar244);
  auVar242 = pmaddwd(auVar58,auVar244);
  auVar228._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar228._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar228._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar228._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar59._0_4_ = auVar242._0_4_ + 0x800 >> 0xc;
  auVar59._4_4_ = auVar242._4_4_ + 0x800 >> 0xc;
  auVar59._8_4_ = auVar242._8_4_ + 0x800 >> 0xc;
  auVar59._12_4_ = auVar242._12_4_ + 0x800 >> 0xc;
  auVar191 = packssdw(auVar228,auVar59);
  local_1d8 = auVar193._0_2_;
  uStack_1d6 = auVar193._2_2_;
  uStack_1d4 = auVar193._4_2_;
  uStack_1d2 = auVar193._6_2_;
  uStack_1d0 = auVar193._8_2_;
  uStack_1ce = auVar193._10_2_;
  uStack_1cc = auVar193._12_2_;
  uStack_1ca = auVar193._14_2_;
  auVar232._0_12_ = auVar430._0_12_;
  auVar232._12_2_ = auVar430._6_2_;
  auVar232._14_2_ = uStack_1d2;
  auVar231._12_4_ = auVar232._12_4_;
  auVar231._0_10_ = auVar430._0_10_;
  auVar231._10_2_ = uStack_1d4;
  auVar230._10_6_ = auVar231._10_6_;
  auVar230._0_8_ = auVar430._0_8_;
  auVar230._8_2_ = auVar430._4_2_;
  auVar229._8_8_ = auVar230._8_8_;
  auVar229._6_2_ = uStack_1d6;
  auVar229._4_2_ = auVar430._2_2_;
  auVar229._0_2_ = auVar430._0_2_;
  auVar229._2_2_ = local_1d8;
  auVar60._2_2_ = uStack_1d0;
  auVar60._0_2_ = auVar430._8_2_;
  auVar60._4_2_ = auVar430._10_2_;
  auVar60._6_2_ = uStack_1ce;
  auVar60._8_2_ = auVar430._12_2_;
  auVar60._10_2_ = uStack_1cc;
  auVar60._12_2_ = auVar430._14_2_;
  auVar60._14_2_ = uStack_1ca;
  auVar185 = pmaddwd(auVar229,auVar34);
  auVar242 = pmaddwd(auVar60,auVar34);
  auVar305._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar305._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar305._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar305._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar318._0_4_ = auVar242._0_4_ + 0x800 >> 0xc;
  auVar318._4_4_ = auVar242._4_4_ + 0x800 >> 0xc;
  auVar318._8_4_ = auVar242._8_4_ + 0x800 >> 0xc;
  auVar318._12_4_ = auVar242._12_4_ + 0x800 >> 0xc;
  auVar250 = packssdw(auVar305,auVar318);
  auVar185 = pmaddwd(auVar229,auVar244);
  auVar242 = pmaddwd(auVar60,auVar244);
  auVar233._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar233._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar233._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar233._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar61._0_4_ = auVar242._0_4_ + 0x800 >> 0xc;
  auVar61._4_4_ = auVar242._4_4_ + 0x800 >> 0xc;
  auVar61._8_4_ = auVar242._8_4_ + 0x800 >> 0xc;
  auVar61._12_4_ = auVar242._12_4_ + 0x800 >> 0xc;
  auVar193 = packssdw(auVar233,auVar61);
  local_408 = auVar195._0_2_;
  uStack_406 = auVar195._2_2_;
  uStack_404 = auVar195._4_2_;
  uStack_402 = auVar195._6_2_;
  uStack_400 = auVar195._8_2_;
  uStack_3fe = auVar195._10_2_;
  uStack_3fc = auVar195._12_2_;
  uStack_3fa = auVar195._14_2_;
  auVar237._0_12_ = auVar489._0_12_;
  auVar237._12_2_ = auVar489._6_2_;
  auVar237._14_2_ = uStack_402;
  auVar236._12_4_ = auVar237._12_4_;
  auVar236._0_10_ = auVar489._0_10_;
  auVar236._10_2_ = uStack_404;
  auVar235._10_6_ = auVar236._10_6_;
  auVar235._0_8_ = auVar489._0_8_;
  auVar235._8_2_ = auVar489._4_2_;
  auVar234._8_8_ = auVar235._8_8_;
  auVar234._6_2_ = uStack_406;
  auVar234._4_2_ = auVar489._2_2_;
  auVar234._0_2_ = auVar489._0_2_;
  auVar234._2_2_ = local_408;
  auVar62._2_2_ = uStack_400;
  auVar62._0_2_ = auVar489._8_2_;
  auVar62._4_2_ = auVar489._10_2_;
  auVar62._6_2_ = uStack_3fe;
  auVar62._8_2_ = auVar489._12_2_;
  auVar62._10_2_ = uStack_3fc;
  auVar62._12_2_ = auVar489._14_2_;
  auVar62._14_2_ = uStack_3fa;
  auVar114 = pmaddwd(auVar234,auVar244);
  auVar185 = pmaddwd(auVar62,auVar244);
  auVar118 = pmaddwd(auVar234,auVar34);
  auVar242 = pmaddwd(auVar62,auVar34);
  auVar504._0_4_ = auVar118._0_4_ + 0x800 >> 0xc;
  auVar504._4_4_ = auVar118._4_4_ + 0x800 >> 0xc;
  auVar504._8_4_ = auVar118._8_4_ + 0x800 >> 0xc;
  auVar504._12_4_ = auVar118._12_4_ + 0x800 >> 0xc;
  auVar325._0_4_ = auVar242._0_4_ + 0x800 >> 0xc;
  auVar325._4_4_ = auVar242._4_4_ + 0x800 >> 0xc;
  auVar325._8_4_ = auVar242._8_4_ + 0x800 >> 0xc;
  auVar325._12_4_ = auVar242._12_4_ + 0x800 >> 0xc;
  auVar489 = packssdw(auVar504,auVar325);
  auVar238._0_4_ = auVar114._0_4_ + 0x800 >> 0xc;
  auVar238._4_4_ = auVar114._4_4_ + 0x800 >> 0xc;
  auVar238._8_4_ = auVar114._8_4_ + 0x800 >> 0xc;
  auVar238._12_4_ = auVar114._12_4_ + 0x800 >> 0xc;
  auVar63._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar63._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar63._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar63._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar195 = packssdw(auVar238,auVar63);
  local_3a8 = auVar198._0_2_;
  uStack_3a6 = auVar198._2_2_;
  uStack_3a4 = auVar198._4_2_;
  uStack_3a2 = auVar198._6_2_;
  uStack_3a0 = auVar198._8_2_;
  uStack_39e = auVar198._10_2_;
  uStack_39c = auVar198._12_2_;
  uStack_39a = auVar198._14_2_;
  auVar67._0_12_ = auVar204._0_12_;
  auVar67._12_2_ = auVar204._6_2_;
  auVar67._14_2_ = uStack_3a2;
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._0_10_ = auVar204._0_10_;
  auVar66._10_2_ = uStack_3a4;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._0_8_ = auVar204._0_8_;
  auVar65._8_2_ = auVar204._4_2_;
  auVar64._8_8_ = auVar65._8_8_;
  auVar64._6_2_ = uStack_3a6;
  auVar64._4_2_ = auVar204._2_2_;
  auVar64._0_2_ = auVar204._0_2_;
  auVar64._2_2_ = local_3a8;
  auVar327._2_2_ = uStack_3a0;
  auVar327._0_2_ = auVar204._8_2_;
  auVar327._4_2_ = auVar204._10_2_;
  auVar327._6_2_ = uStack_39e;
  auVar327._8_2_ = auVar204._12_2_;
  auVar327._10_2_ = uStack_39c;
  auVar327._12_2_ = auVar204._14_2_;
  auVar327._14_2_ = uStack_39a;
  auVar185 = pmaddwd(auVar64,auVar248);
  auVar242 = pmaddwd(auVar327,auVar248);
  auVar306._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar306._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar306._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar306._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar391._0_4_ = auVar242._0_4_ + 0x800 >> 0xc;
  auVar391._4_4_ = auVar242._4_4_ + 0x800 >> 0xc;
  auVar391._8_4_ = auVar242._8_4_ + 0x800 >> 0xc;
  auVar391._12_4_ = auVar242._12_4_ + 0x800 >> 0xc;
  auVar354 = packssdw(auVar306,auVar391);
  auVar242 = pmaddwd(auVar64,auVar34);
  auVar185 = pmaddwd(auVar327,auVar34);
  auVar68._0_4_ = auVar242._0_4_ + 0x800 >> 0xc;
  auVar68._4_4_ = auVar242._4_4_ + 0x800 >> 0xc;
  auVar68._8_4_ = auVar242._8_4_ + 0x800 >> 0xc;
  auVar68._12_4_ = auVar242._12_4_ + 0x800 >> 0xc;
  auVar328._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar328._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar328._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar328._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar118 = packssdw(auVar68,auVar328);
  local_378 = auVar514._0_2_;
  uStack_376 = auVar514._2_2_;
  uStack_374 = auVar514._4_2_;
  uStack_372 = auVar514._6_2_;
  uStack_370 = auVar514._8_2_;
  uStack_36e = auVar514._10_2_;
  uStack_36c = auVar514._12_2_;
  uStack_36a = auVar514._14_2_;
  auVar72._0_12_ = auVar458._0_12_;
  auVar72._12_2_ = auVar458._6_2_;
  auVar72._14_2_ = uStack_372;
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._0_10_ = auVar458._0_10_;
  auVar71._10_2_ = uStack_374;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._0_8_ = auVar458._0_8_;
  auVar70._8_2_ = auVar458._4_2_;
  auVar69._8_8_ = auVar70._8_8_;
  auVar69._6_2_ = uStack_376;
  auVar69._4_2_ = auVar458._2_2_;
  auVar69._0_2_ = auVar458._0_2_;
  auVar69._2_2_ = local_378;
  auVar345._2_2_ = uStack_370;
  auVar345._0_2_ = auVar458._8_2_;
  auVar345._4_2_ = auVar458._10_2_;
  auVar345._6_2_ = uStack_36e;
  auVar345._8_2_ = auVar458._12_2_;
  auVar345._10_2_ = uStack_36c;
  auVar345._12_2_ = auVar458._14_2_;
  auVar345._14_2_ = uStack_36a;
  auVar185 = pmaddwd(auVar69,auVar248);
  auVar242 = pmaddwd(auVar345,auVar248);
  auVar307._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar307._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar307._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar307._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar408._0_4_ = auVar242._0_4_ + 0x800 >> 0xc;
  auVar408._4_4_ = auVar242._4_4_ + 0x800 >> 0xc;
  auVar408._8_4_ = auVar242._8_4_ + 0x800 >> 0xc;
  auVar408._12_4_ = auVar242._12_4_ + 0x800 >> 0xc;
  auVar244 = packssdw(auVar307,auVar408);
  auVar242 = pmaddwd(auVar69,auVar34);
  auVar185 = pmaddwd(auVar345,auVar34);
  auVar73._0_4_ = auVar242._0_4_ + 0x800 >> 0xc;
  auVar73._4_4_ = auVar242._4_4_ + 0x800 >> 0xc;
  auVar73._8_4_ = auVar242._8_4_ + 0x800 >> 0xc;
  auVar73._12_4_ = auVar242._12_4_ + 0x800 >> 0xc;
  auVar346._0_4_ = auVar185._0_4_ + 0x800 >> 0xc;
  auVar346._4_4_ = auVar185._4_4_ + 0x800 >> 0xc;
  auVar346._8_4_ = auVar185._8_4_ + 0x800 >> 0xc;
  auVar346._12_4_ = auVar185._12_4_ + 0x800 >> 0xc;
  auVar114 = packssdw(auVar73,auVar346);
  local_2c8 = auVar7._0_2_;
  uStack_2c6 = auVar7._2_2_;
  uStack_2c4 = auVar7._4_2_;
  uStack_2c2 = auVar7._6_2_;
  uStack_2c0 = auVar7._8_2_;
  uStack_2be = auVar7._10_2_;
  uStack_2bc = auVar7._12_2_;
  uStack_2ba = auVar7._14_2_;
  auVar77._0_12_ = auVar97._0_12_;
  auVar77._12_2_ = auVar97._6_2_;
  auVar77._14_2_ = uStack_2c2;
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._0_10_ = auVar97._0_10_;
  auVar76._10_2_ = uStack_2c4;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._0_8_ = auVar97._0_8_;
  auVar75._8_2_ = auVar97._4_2_;
  auVar74._8_8_ = auVar75._8_8_;
  auVar74._6_2_ = uStack_2c6;
  auVar74._4_2_ = auVar97._2_2_;
  auVar74._0_2_ = auVar97._0_2_;
  auVar74._2_2_ = local_2c8;
  auVar308._2_2_ = uStack_2c0;
  auVar308._0_2_ = auVar97._8_2_;
  auVar308._4_2_ = auVar97._10_2_;
  auVar308._6_2_ = uStack_2be;
  auVar308._8_2_ = auVar97._12_2_;
  auVar308._10_2_ = uStack_2bc;
  auVar308._12_2_ = auVar97._14_2_;
  auVar308._14_2_ = uStack_2ba;
  auVar97 = pmaddwd(auVar74,auVar248);
  auVar242 = pmaddwd(auVar308,auVar248);
  auVar450._0_4_ = auVar97._0_4_ + 0x800 >> 0xc;
  auVar450._4_4_ = auVar97._4_4_ + 0x800 >> 0xc;
  auVar450._8_4_ = auVar97._8_4_ + 0x800 >> 0xc;
  auVar450._12_4_ = auVar97._12_4_ + 0x800 >> 0xc;
  auVar97._0_4_ = auVar242._0_4_ + 0x800 >> 0xc;
  auVar97._4_4_ = auVar242._4_4_ + 0x800 >> 0xc;
  auVar97._8_4_ = auVar242._8_4_ + 0x800 >> 0xc;
  auVar97._12_4_ = auVar242._12_4_ + 0x800 >> 0xc;
  auVar430 = packssdw(auVar450,auVar97);
  auVar242 = pmaddwd(auVar74,auVar34);
  auVar97 = pmaddwd(auVar308,auVar34);
  auVar78._0_4_ = auVar242._0_4_ + 0x800 >> 0xc;
  auVar78._4_4_ = auVar242._4_4_ + 0x800 >> 0xc;
  auVar78._8_4_ = auVar242._8_4_ + 0x800 >> 0xc;
  auVar78._12_4_ = auVar242._12_4_ + 0x800 >> 0xc;
  auVar309._0_4_ = auVar97._0_4_ + 0x800 >> 0xc;
  auVar309._4_4_ = auVar97._4_4_ + 0x800 >> 0xc;
  auVar309._8_4_ = auVar97._8_4_ + 0x800 >> 0xc;
  auVar309._12_4_ = auVar97._12_4_ + 0x800 >> 0xc;
  auVar120 = packssdw(auVar78,auVar309);
  local_428 = auVar98._0_2_;
  uStack_426 = auVar98._2_2_;
  uStack_424 = auVar98._4_2_;
  uStack_422 = auVar98._6_2_;
  uStack_420 = auVar98._8_2_;
  uStack_41e = auVar98._10_2_;
  uStack_41c = auVar98._12_2_;
  uStack_41a = auVar98._14_2_;
  auVar7._0_12_ = auVar388._0_12_;
  auVar7._12_2_ = auVar388._6_2_;
  auVar7._14_2_ = uStack_422;
  auVar98._12_4_ = auVar7._12_4_;
  auVar98._0_10_ = auVar388._0_10_;
  auVar98._10_2_ = uStack_424;
  auVar338._10_6_ = auVar98._10_6_;
  auVar338._0_8_ = auVar388._0_8_;
  auVar338._8_2_ = auVar388._4_2_;
  auVar242._8_8_ = auVar338._8_8_;
  auVar242._6_2_ = uStack_426;
  auVar242._4_2_ = auVar388._2_2_;
  auVar242._0_2_ = auVar388._0_2_;
  auVar242._2_2_ = local_428;
  auVar79._2_2_ = uStack_420;
  auVar79._0_2_ = auVar388._8_2_;
  auVar79._4_2_ = auVar388._10_2_;
  auVar79._6_2_ = uStack_41e;
  auVar79._8_2_ = auVar388._12_2_;
  auVar79._10_2_ = uStack_41c;
  auVar79._12_2_ = auVar388._14_2_;
  auVar79._14_2_ = uStack_41a;
  auVar98 = pmaddwd(auVar242,auVar248);
  auVar7 = pmaddwd(auVar248,auVar79);
  auVar242 = pmaddwd(auVar242,auVar34);
  auVar97 = pmaddwd(auVar79,auVar34);
  auVar396._0_4_ = auVar98._0_4_ + 0x800 >> 0xc;
  auVar396._4_4_ = auVar98._4_4_ + 0x800 >> 0xc;
  auVar396._8_4_ = auVar98._8_4_ + 0x800 >> 0xc;
  auVar396._12_4_ = auVar98._12_4_ + 0x800 >> 0xc;
  auVar239._0_4_ = auVar7._0_4_ + 0x800 >> 0xc;
  auVar239._4_4_ = auVar7._4_4_ + 0x800 >> 0xc;
  auVar239._8_4_ = auVar7._8_4_ + 0x800 >> 0xc;
  auVar239._12_4_ = auVar7._12_4_ + 0x800 >> 0xc;
  auVar248 = packssdw(auVar396,auVar239);
  auVar518._0_4_ = auVar242._0_4_ + 0x800 >> 0xc;
  auVar518._4_4_ = auVar242._4_4_ + 0x800 >> 0xc;
  auVar518._8_4_ = auVar242._8_4_ + 0x800 >> 0xc;
  auVar518._12_4_ = auVar242._12_4_ + 0x800 >> 0xc;
  auVar80._0_4_ = auVar97._0_4_ + 0x800 >> 0xc;
  auVar80._4_4_ = auVar97._4_4_ + 0x800 >> 0xc;
  auVar80._8_4_ = auVar97._8_4_ + 0x800 >> 0xc;
  auVar80._12_4_ = auVar97._12_4_ + 0x800 >> 0xc;
  auVar242 = packssdw(auVar518,auVar80);
  auVar197 = paddsw(auVar472,auVar116);
  auVar97 = psubsw(auVar472,auVar116);
  auVar403 = paddsw(auVar377,auVar96);
  auVar7 = psubsw(auVar377,auVar96);
  auVar457 = paddsw(auVar332,auVar466);
  auVar98 = psubsw(auVar332,auVar466);
  auVar252 = paddsw(auVar488,auVar433);
  auVar96 = psubsw(auVar488,auVar433);
  auVar122 = paddsw(auVar314,auVar474);
  auVar185 = psubsw(auVar314,auVar474);
  auVar332 = paddsw(auVar6,auVar513);
  auVar6 = psubsw(auVar6,auVar513);
  auVar488 = paddsw(auVar108,auVar189);
  auVar108 = psubsw(auVar108,auVar189);
  auVar513 = paddsw(auVar106,auVar335);
  auVar106 = psubsw(auVar106,auVar335);
  auVar364._0_12_ = auVar431._0_12_;
  auVar364._12_2_ = auVar431._6_2_;
  auVar364._14_2_ = auVar187._6_2_;
  auVar363._12_4_ = auVar364._12_4_;
  auVar363._0_10_ = auVar431._0_10_;
  auVar363._10_2_ = auVar187._4_2_;
  auVar362._10_6_ = auVar363._10_6_;
  auVar362._0_8_ = auVar431._0_8_;
  auVar362._8_2_ = auVar431._4_2_;
  auVar361._8_8_ = auVar362._8_8_;
  auVar361._6_2_ = auVar187._2_2_;
  auVar361._4_2_ = auVar431._2_2_;
  auVar361._0_2_ = auVar431._0_2_;
  auVar361._2_2_ = auVar187._0_2_;
  auVar527._2_2_ = auVar187._8_2_;
  auVar527._0_2_ = auVar431._8_2_;
  auVar527._4_2_ = auVar431._10_2_;
  auVar527._6_2_ = auVar187._10_2_;
  auVar527._8_2_ = auVar431._12_2_;
  auVar527._10_2_ = auVar187._12_2_;
  auVar527._12_2_ = auVar431._14_2_;
  auVar527._14_2_ = auVar187._14_2_;
  auVar116 = pmaddwd(auVar361,auVar284);
  auVar187 = pmaddwd(auVar527,auVar284);
  auVar81._0_4_ = auVar116._0_4_ + 0x800 >> 0xc;
  auVar81._4_4_ = auVar116._4_4_ + 0x800 >> 0xc;
  auVar81._8_4_ = auVar116._8_4_ + 0x800 >> 0xc;
  auVar81._12_4_ = auVar116._12_4_ + 0x800 >> 0xc;
  auVar377._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar377._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar377._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar377._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar314 = packssdw(auVar81,auVar377);
  auVar187 = pmaddwd(auVar361,auVar49);
  auVar116 = pmaddwd(auVar527,auVar49);
  auVar365._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar365._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar365._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar365._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar528._0_4_ = auVar116._0_4_ + 0x800 >> 0xc;
  auVar528._4_4_ = auVar116._4_4_ + 0x800 >> 0xc;
  auVar528._8_4_ = auVar116._8_4_ + 0x800 >> 0xc;
  auVar528._12_4_ = auVar116._12_4_ + 0x800 >> 0xc;
  auVar316 = packssdw(auVar365,auVar528);
  local_d8 = auVar124._0_2_;
  uStack_d6 = auVar124._2_2_;
  uStack_d4 = auVar124._4_2_;
  uStack_d2 = auVar124._6_2_;
  uStack_d0 = auVar124._8_2_;
  uStack_ce = auVar124._10_2_;
  uStack_cc = auVar124._12_2_;
  uStack_ca = auVar124._14_2_;
  auVar426._0_12_ = auVar334._0_12_;
  auVar426._12_2_ = auVar334._6_2_;
  auVar426._14_2_ = uStack_d2;
  auVar425._12_4_ = auVar426._12_4_;
  auVar425._0_10_ = auVar334._0_10_;
  auVar425._10_2_ = uStack_d4;
  auVar424._10_6_ = auVar425._10_6_;
  auVar424._0_8_ = auVar334._0_8_;
  auVar424._8_2_ = auVar334._4_2_;
  auVar423._8_8_ = auVar424._8_8_;
  auVar423._6_2_ = uStack_d6;
  auVar423._4_2_ = auVar334._2_2_;
  auVar423._0_2_ = auVar334._0_2_;
  auVar423._2_2_ = local_d8;
  auVar165._2_2_ = uStack_d0;
  auVar165._0_2_ = auVar334._8_2_;
  auVar165._4_2_ = auVar334._10_2_;
  auVar165._6_2_ = uStack_ce;
  auVar165._8_2_ = auVar334._12_2_;
  auVar165._10_2_ = uStack_cc;
  auVar165._12_2_ = auVar334._14_2_;
  auVar165._14_2_ = uStack_ca;
  auVar124 = pmaddwd(auVar423,auVar284);
  auVar187 = pmaddwd(auVar165,auVar284);
  auVar347._0_4_ = auVar124._0_4_ + 0x800 >> 0xc;
  auVar347._4_4_ = auVar124._4_4_ + 0x800 >> 0xc;
  auVar347._8_4_ = auVar124._8_4_ + 0x800 >> 0xc;
  auVar347._12_4_ = auVar124._12_4_ + 0x800 >> 0xc;
  auVar431._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar431._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar431._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar431._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar373 = packssdw(auVar347,auVar431);
  auVar124 = pmaddwd(auVar423,auVar49);
  auVar187 = pmaddwd(auVar165,auVar49);
  auVar427._0_4_ = auVar124._0_4_ + 0x800 >> 0xc;
  auVar427._4_4_ = auVar124._4_4_ + 0x800 >> 0xc;
  auVar427._8_4_ = auVar124._8_4_ + 0x800 >> 0xc;
  auVar427._12_4_ = auVar124._12_4_ + 0x800 >> 0xc;
  auVar166._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar166._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar166._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar166._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar325 = packssdw(auVar427,auVar166);
  local_1b8 = auVar288._0_2_;
  uStack_1b6 = auVar288._2_2_;
  uStack_1b4 = auVar288._4_2_;
  uStack_1b2 = auVar288._6_2_;
  uStack_1b0 = auVar288._8_2_;
  uStack_1ae = auVar288._10_2_;
  uStack_1ac = auVar288._12_2_;
  uStack_1aa = auVar288._14_2_;
  auVar383._0_12_ = auVar4._0_12_;
  auVar383._12_2_ = auVar4._6_2_;
  auVar383._14_2_ = uStack_1b2;
  auVar382._12_4_ = auVar383._12_4_;
  auVar382._0_10_ = auVar4._0_10_;
  auVar382._10_2_ = uStack_1b4;
  auVar381._10_6_ = auVar382._10_6_;
  auVar381._0_8_ = auVar4._0_8_;
  auVar381._8_2_ = auVar4._4_2_;
  auVar380._8_8_ = auVar381._8_8_;
  auVar380._6_2_ = uStack_1b6;
  auVar380._4_2_ = auVar4._2_2_;
  auVar380._0_2_ = auVar4._0_2_;
  auVar380._2_2_ = local_1b8;
  auVar475._2_2_ = uStack_1b0;
  auVar475._0_2_ = auVar4._8_2_;
  auVar475._4_2_ = auVar4._10_2_;
  auVar475._6_2_ = uStack_1ae;
  auVar475._8_2_ = auVar4._12_2_;
  auVar475._10_2_ = uStack_1ac;
  auVar475._12_2_ = auVar4._14_2_;
  auVar475._14_2_ = uStack_1aa;
  auVar187 = pmaddwd(auVar380,auVar284);
  auVar4 = pmaddwd(auVar475,auVar284);
  auVar310._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar310._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar310._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar310._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar466._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar466._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar466._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar466._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar335 = packssdw(auVar310,auVar466);
  auVar4 = pmaddwd(auVar380,auVar49);
  auVar187 = pmaddwd(auVar475,auVar49);
  auVar384._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar384._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar384._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar384._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar476._0_4_ = auVar187._0_4_ + 0x800 >> 0xc;
  auVar476._4_4_ = auVar187._4_4_ + 0x800 >> 0xc;
  auVar476._8_4_ = auVar187._8_4_ + 0x800 >> 0xc;
  auVar476._12_4_ = auVar187._12_4_ + 0x800 >> 0xc;
  auVar317 = packssdw(auVar384,auVar476);
  local_188 = auVar497._0_2_;
  uStack_186 = auVar497._2_2_;
  uStack_184 = auVar497._4_2_;
  uStack_182 = auVar497._6_2_;
  uStack_180 = auVar497._8_2_;
  uStack_17e = auVar497._10_2_;
  uStack_17c = auVar497._12_2_;
  uStack_17a = auVar497._14_2_;
  auVar480._0_12_ = auVar100._0_12_;
  auVar480._12_2_ = auVar100._6_2_;
  auVar480._14_2_ = uStack_182;
  auVar479._12_4_ = auVar480._12_4_;
  auVar479._0_10_ = auVar100._0_10_;
  auVar479._10_2_ = uStack_184;
  auVar478._10_6_ = auVar479._10_6_;
  auVar478._0_8_ = auVar100._0_8_;
  auVar478._8_2_ = auVar100._4_2_;
  auVar477._8_8_ = auVar478._8_8_;
  auVar477._6_2_ = uStack_186;
  auVar477._4_2_ = auVar100._2_2_;
  auVar477._0_2_ = auVar100._0_2_;
  auVar477._2_2_ = local_188;
  auVar497._2_2_ = uStack_180;
  auVar497._0_2_ = auVar100._8_2_;
  auVar497._4_2_ = auVar100._10_2_;
  auVar497._6_2_ = uStack_17e;
  auVar497._8_2_ = auVar100._12_2_;
  auVar497._10_2_ = uStack_17c;
  auVar497._12_2_ = auVar100._14_2_;
  auVar497._14_2_ = uStack_17a;
  auVar100 = pmaddwd(auVar477,auVar284);
  auVar4 = pmaddwd(auVar497,auVar284);
  auVar240._0_4_ = auVar100._0_4_ + 0x800 >> 0xc;
  auVar240._4_4_ = auVar100._4_4_ + 0x800 >> 0xc;
  auVar240._8_4_ = auVar100._8_4_ + 0x800 >> 0xc;
  auVar240._12_4_ = auVar100._12_4_ + 0x800 >> 0xc;
  auVar529._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar529._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar529._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar529._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar288 = packssdw(auVar240,auVar529);
  auVar4 = pmaddwd(auVar477,auVar49);
  auVar100 = pmaddwd(auVar497,auVar49);
  auVar481._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar481._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar481._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar481._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar433._0_4_ = auVar100._0_4_ + 0x800 >> 0xc;
  auVar433._4_4_ = auVar100._4_4_ + 0x800 >> 0xc;
  auVar433._8_4_ = auVar100._8_4_ + 0x800 >> 0xc;
  auVar433._12_4_ = auVar100._12_4_ + 0x800 >> 0xc;
  auVar408 = packssdw(auVar481,auVar433);
  auVar458 = paddsw(auVar387,auVar404);
  auVar100 = psubsw(auVar387,auVar404);
  auVar388 = paddsw(auVar2,auVar410);
  auVar2 = psubsw(auVar2,auVar410);
  auVar198 = paddsw(auVar315,auVar389);
  auVar4 = psubsw(auVar315,auVar389);
  auVar389 = paddsw(auVar312,auVar3);
  auVar312 = psubsw(auVar312,auVar3);
  auVar3 = paddsw(auVar372,auVar248);
  auVar334 = psubsw(auVar372,auVar248);
  auVar187 = paddsw(auVar246,auVar430);
  auVar372 = psubsw(auVar246,auVar430);
  auVar124 = paddsw(auVar250,auVar244);
  auVar244 = psubsw(auVar250,auVar244);
  auVar116 = paddsw(auVar489,auVar354);
  auVar338 = psubsw(auVar489,auVar354);
  auVar387 = psubsw(auVar442,auVar411);
  auVar246 = paddsw(auVar442,auVar411);
  auVar430 = psubsw(auVar524,auVar412);
  auVar248 = paddsw(auVar524,auVar412);
  auVar250 = psubsw(auVar110,auVar439);
  auVar110 = paddsw(auVar110,auVar439);
  auVar189 = psubsw(auVar179,auVar441);
  auVar179 = paddsw(auVar179,auVar441);
  auVar315 = psubsw(auVar112,auVar242);
  auVar242 = paddsw(auVar242,auVar112);
  auVar318 = psubsw(auVar191,auVar120);
  auVar112 = paddsw(auVar120,auVar191);
  auVar514 = psubsw(auVar193,auVar114);
  auVar114 = paddsw(auVar114,auVar193);
  auVar391 = psubsw(auVar195,auVar118);
  auVar118 = paddsw(auVar118,auVar195);
  auVar204 = paddsw(auVar197,auVar104);
  auVar104 = psubsw(auVar197,auVar104);
  auVar489 = paddsw(auVar403,auVar177);
  auVar177 = psubsw(auVar403,auVar177);
  auVar404 = paddsw(auVar457,auVar181);
  auVar181 = psubsw(auVar457,auVar181);
  auVar191 = paddsw(auVar252,auVar183);
  auVar183 = psubsw(auVar252,auVar183);
  auVar193 = paddsw(auVar122,auVar316);
  auVar120 = psubsw(auVar122,auVar316);
  auVar195 = paddsw(auVar332,auVar325);
  auVar252 = psubsw(auVar332,auVar325);
  auVar197 = paddsw(auVar488,auVar317);
  auVar122 = psubsw(auVar488,auVar317);
  auVar403 = paddsw(auVar513,auVar408);
  auVar332 = psubsw(auVar513,auVar408);
  auVar457 = paddsw(auVar106,auVar288);
  auVar106 = psubsw(auVar106,auVar288);
  auVar488 = paddsw(auVar108,auVar335);
  auVar108 = psubsw(auVar108,auVar335);
  auVar513 = paddsw(auVar6,auVar373);
  auVar6 = psubsw(auVar6,auVar373);
  auVar288 = paddsw(auVar185,auVar314);
  auVar185 = psubsw(auVar185,auVar314);
  auVar314 = paddsw(auVar96,auVar102);
  auVar96 = psubsw(auVar96,auVar102);
  auVar102 = paddsw(auVar98,auVar5);
  auVar98 = psubsw(auVar98,auVar5);
  auVar335 = paddsw(auVar7,auVar395);
  auVar7 = psubsw(auVar7,auVar395);
  auVar354 = paddsw(auVar97,auVar525);
  auVar97 = psubsw(auVar97,auVar525);
  auVar485._0_12_ = auVar338._0_12_;
  auVar485._12_2_ = auVar338._6_2_;
  auVar485._14_2_ = auVar391._6_2_;
  auVar484._12_4_ = auVar485._12_4_;
  auVar484._0_10_ = auVar338._0_10_;
  auVar484._10_2_ = auVar391._4_2_;
  auVar483._10_6_ = auVar484._10_6_;
  auVar483._0_8_ = auVar338._0_8_;
  auVar483._8_2_ = auVar338._4_2_;
  auVar482._8_8_ = auVar483._8_8_;
  auVar482._6_2_ = auVar391._2_2_;
  auVar482._4_2_ = auVar338._2_2_;
  auVar482._0_2_ = auVar338._0_2_;
  auVar482._2_2_ = auVar391._0_2_;
  auVar505._2_2_ = auVar391._8_2_;
  auVar505._0_2_ = auVar338._8_2_;
  auVar505._4_2_ = auVar338._10_2_;
  auVar505._6_2_ = auVar391._10_2_;
  auVar505._8_2_ = auVar338._12_2_;
  auVar505._10_2_ = auVar391._12_2_;
  auVar505._12_2_ = auVar338._14_2_;
  auVar505._14_2_ = auVar391._14_2_;
  auVar373 = pmaddwd(auVar482,auVar284);
  auVar5 = pmaddwd(auVar505,auVar284);
  auVar82._0_4_ = auVar373._0_4_ + 0x800 >> 0xc;
  auVar82._4_4_ = auVar373._4_4_ + 0x800 >> 0xc;
  auVar82._8_4_ = auVar373._8_4_ + 0x800 >> 0xc;
  auVar82._12_4_ = auVar373._12_4_ + 0x800 >> 0xc;
  auVar439._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar439._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar439._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar439._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar373 = packssdw(auVar82,auVar439);
  auVar5 = pmaddwd(auVar482,auVar49);
  auVar316 = pmaddwd(auVar505,auVar49);
  auVar486._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar486._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar486._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar486._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar506._0_4_ = auVar316._0_4_ + 0x800 >> 0xc;
  auVar506._4_4_ = auVar316._4_4_ + 0x800 >> 0xc;
  auVar506._8_4_ = auVar316._8_4_ + 0x800 >> 0xc;
  auVar506._12_4_ = auVar316._12_4_ + 0x800 >> 0xc;
  auVar391 = packssdw(auVar486,auVar506);
  auVar454._0_12_ = auVar244._0_12_;
  auVar454._12_2_ = auVar244._6_2_;
  auVar454._14_2_ = auVar514._6_2_;
  auVar453._12_4_ = auVar454._12_4_;
  auVar453._0_10_ = auVar244._0_10_;
  auVar453._10_2_ = auVar514._4_2_;
  auVar452._10_6_ = auVar453._10_6_;
  auVar452._0_8_ = auVar244._0_8_;
  auVar452._8_2_ = auVar244._4_2_;
  auVar451._8_8_ = auVar452._8_8_;
  auVar451._6_2_ = auVar514._2_2_;
  auVar451._4_2_ = auVar244._2_2_;
  auVar451._0_2_ = auVar244._0_2_;
  auVar451._2_2_ = auVar514._0_2_;
  auVar167._2_2_ = auVar514._8_2_;
  auVar167._0_2_ = auVar244._8_2_;
  auVar167._4_2_ = auVar244._10_2_;
  auVar167._6_2_ = auVar514._10_2_;
  auVar167._8_2_ = auVar244._12_2_;
  auVar167._10_2_ = auVar514._12_2_;
  auVar167._12_2_ = auVar244._14_2_;
  auVar167._14_2_ = auVar514._14_2_;
  auVar244 = pmaddwd(auVar451,auVar284);
  auVar5 = pmaddwd(auVar167,auVar284);
  auVar83._0_4_ = auVar244._0_4_ + 0x800 >> 0xc;
  auVar83._4_4_ = auVar244._4_4_ + 0x800 >> 0xc;
  auVar83._8_4_ = auVar244._8_4_ + 0x800 >> 0xc;
  auVar83._12_4_ = auVar244._12_4_ + 0x800 >> 0xc;
  auVar441._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar441._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar441._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar441._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar244 = packssdw(auVar83,auVar441);
  auVar514 = pmaddwd(auVar451,auVar49);
  auVar5 = pmaddwd(auVar167,auVar49);
  auVar455._0_4_ = auVar514._0_4_ + 0x800 >> 0xc;
  auVar455._4_4_ = auVar514._4_4_ + 0x800 >> 0xc;
  auVar455._8_4_ = auVar514._8_4_ + 0x800 >> 0xc;
  auVar455._12_4_ = auVar514._12_4_ + 0x800 >> 0xc;
  auVar168._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar168._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar168._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar168._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar325 = packssdw(auVar455,auVar168);
  auVar510._0_12_ = auVar372._0_12_;
  auVar510._12_2_ = auVar372._6_2_;
  auVar510._14_2_ = auVar318._6_2_;
  auVar509._12_4_ = auVar510._12_4_;
  auVar509._0_10_ = auVar372._0_10_;
  auVar509._10_2_ = auVar318._4_2_;
  auVar508._10_6_ = auVar509._10_6_;
  auVar508._0_8_ = auVar372._0_8_;
  auVar508._8_2_ = auVar372._4_2_;
  auVar507._8_8_ = auVar508._8_8_;
  auVar507._6_2_ = auVar318._2_2_;
  auVar507._4_2_ = auVar372._2_2_;
  auVar507._0_2_ = auVar372._0_2_;
  auVar507._2_2_ = auVar318._0_2_;
  auVar169._2_2_ = auVar318._8_2_;
  auVar169._0_2_ = auVar372._8_2_;
  auVar169._4_2_ = auVar372._10_2_;
  auVar169._6_2_ = auVar318._10_2_;
  auVar169._8_2_ = auVar372._12_2_;
  auVar169._10_2_ = auVar318._12_2_;
  auVar169._12_2_ = auVar372._14_2_;
  auVar169._14_2_ = auVar318._14_2_;
  auVar372 = pmaddwd(auVar507,auVar284);
  auVar5 = pmaddwd(auVar169,auVar284);
  auVar84._0_4_ = auVar372._0_4_ + 0x800 >> 0xc;
  auVar84._4_4_ = auVar372._4_4_ + 0x800 >> 0xc;
  auVar84._8_4_ = auVar372._8_4_ + 0x800 >> 0xc;
  auVar84._12_4_ = auVar372._12_4_ + 0x800 >> 0xc;
  auVar442._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar442._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar442._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar442._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar372 = packssdw(auVar84,auVar442);
  auVar514 = pmaddwd(auVar507,auVar49);
  auVar5 = pmaddwd(auVar169,auVar49);
  auVar511._0_4_ = auVar514._0_4_ + 0x800 >> 0xc;
  auVar511._4_4_ = auVar514._4_4_ + 0x800 >> 0xc;
  auVar511._8_4_ = auVar514._8_4_ + 0x800 >> 0xc;
  auVar511._12_4_ = auVar514._12_4_ + 0x800 >> 0xc;
  auVar170._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar170._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar170._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar170._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar318 = packssdw(auVar511,auVar170);
  local_1c8 = auVar315._0_2_;
  uStack_1c6 = auVar315._2_2_;
  uStack_1c4 = auVar315._4_2_;
  uStack_1c2 = auVar315._6_2_;
  uStack_1c0 = auVar315._8_2_;
  uStack_1be = auVar315._10_2_;
  uStack_1bc = auVar315._12_2_;
  uStack_1ba = auVar315._14_2_;
  auVar400._0_12_ = auVar334._0_12_;
  auVar400._12_2_ = auVar334._6_2_;
  auVar400._14_2_ = uStack_1c2;
  auVar399._12_4_ = auVar400._12_4_;
  auVar399._0_10_ = auVar334._0_10_;
  auVar399._10_2_ = uStack_1c4;
  auVar398._10_6_ = auVar399._10_6_;
  auVar398._0_8_ = auVar334._0_8_;
  auVar398._8_2_ = auVar334._4_2_;
  auVar397._8_8_ = auVar398._8_8_;
  auVar397._6_2_ = uStack_1c6;
  auVar397._4_2_ = auVar334._2_2_;
  auVar397._0_2_ = auVar334._0_2_;
  auVar397._2_2_ = local_1c8;
  auVar85._2_2_ = uStack_1c0;
  auVar85._0_2_ = auVar334._8_2_;
  auVar85._4_2_ = auVar334._10_2_;
  auVar85._6_2_ = uStack_1be;
  auVar85._8_2_ = auVar334._12_2_;
  auVar85._10_2_ = uStack_1bc;
  auVar85._12_2_ = auVar334._14_2_;
  auVar85._14_2_ = uStack_1ba;
  auVar334 = pmaddwd(auVar397,auVar284);
  auVar5 = pmaddwd(auVar85,auVar284);
  auVar171._0_4_ = auVar334._0_4_ + 0x800 >> 0xc;
  auVar171._4_4_ = auVar334._4_4_ + 0x800 >> 0xc;
  auVar171._8_4_ = auVar334._8_4_ + 0x800 >> 0xc;
  auVar171._12_4_ = auVar334._12_4_ + 0x800 >> 0xc;
  auVar524._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar524._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar524._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar524._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar334 = packssdw(auVar171,auVar524);
  auVar315 = pmaddwd(auVar397,auVar49);
  auVar5 = pmaddwd(auVar85,auVar49);
  auVar401._0_4_ = auVar315._0_4_ + 0x800 >> 0xc;
  auVar401._4_4_ = auVar315._4_4_ + 0x800 >> 0xc;
  auVar401._8_4_ = auVar315._8_4_ + 0x800 >> 0xc;
  auVar401._12_4_ = auVar315._12_4_ + 0x800 >> 0xc;
  auVar86._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar86._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar86._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar86._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar316 = packssdw(auVar401,auVar86);
  local_c8 = auVar189._0_2_;
  uStack_c6 = auVar189._2_2_;
  uStack_c4 = auVar189._4_2_;
  uStack_c2 = auVar189._6_2_;
  uStack_c0 = auVar189._8_2_;
  uStack_be = auVar189._10_2_;
  uStack_bc = auVar189._12_2_;
  uStack_ba = auVar189._14_2_;
  auVar369._0_12_ = auVar312._0_12_;
  auVar369._12_2_ = auVar312._6_2_;
  auVar369._14_2_ = uStack_c2;
  auVar368._12_4_ = auVar369._12_4_;
  auVar368._0_10_ = auVar312._0_10_;
  auVar368._10_2_ = uStack_c4;
  auVar367._10_6_ = auVar368._10_6_;
  auVar367._0_8_ = auVar312._0_8_;
  auVar367._8_2_ = auVar312._4_2_;
  auVar366._8_8_ = auVar367._8_8_;
  auVar366._6_2_ = uStack_c6;
  auVar366._4_2_ = auVar312._2_2_;
  auVar366._0_2_ = auVar312._0_2_;
  auVar366._2_2_ = local_c8;
  auVar87._2_2_ = uStack_c0;
  auVar87._0_2_ = auVar312._8_2_;
  auVar87._4_2_ = auVar312._10_2_;
  auVar87._6_2_ = uStack_be;
  auVar87._8_2_ = auVar312._12_2_;
  auVar87._10_2_ = uStack_bc;
  auVar87._12_2_ = auVar312._14_2_;
  auVar87._14_2_ = uStack_ba;
  auVar5 = pmaddwd(auVar366,auVar284);
  auVar312 = pmaddwd(auVar87,auVar284);
  auVar428._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar428._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar428._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar428._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar525._0_4_ = auVar312._0_4_ + 0x800 >> 0xc;
  auVar525._4_4_ = auVar312._4_4_ + 0x800 >> 0xc;
  auVar525._8_4_ = auVar312._8_4_ + 0x800 >> 0xc;
  auVar525._12_4_ = auVar312._12_4_ + 0x800 >> 0xc;
  auVar317 = packssdw(auVar428,auVar525);
  auVar5 = pmaddwd(auVar366,auVar49);
  auVar312 = pmaddwd(auVar87,auVar49);
  auVar370._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar370._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar370._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar370._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar88._0_4_ = auVar312._0_4_ + 0x800 >> 0xc;
  auVar88._4_4_ = auVar312._4_4_ + 0x800 >> 0xc;
  auVar88._8_4_ = auVar312._8_4_ + 0x800 >> 0xc;
  auVar88._12_4_ = auVar312._12_4_ + 0x800 >> 0xc;
  auVar315 = packssdw(auVar370,auVar88);
  local_48 = auVar250._0_2_;
  uStack_46 = auVar250._2_2_;
  uStack_44 = auVar250._4_2_;
  uStack_42 = auVar250._6_2_;
  uStack_40 = auVar250._8_2_;
  uStack_3e = auVar250._10_2_;
  uStack_3c = auVar250._12_2_;
  uStack_3a = auVar250._14_2_;
  auVar351._0_12_ = auVar4._0_12_;
  auVar351._12_2_ = auVar4._6_2_;
  auVar351._14_2_ = uStack_42;
  auVar350._12_4_ = auVar351._12_4_;
  auVar350._0_10_ = auVar4._0_10_;
  auVar350._10_2_ = uStack_44;
  auVar349._10_6_ = auVar350._10_6_;
  auVar349._0_8_ = auVar4._0_8_;
  auVar349._8_2_ = auVar4._4_2_;
  auVar348._8_8_ = auVar349._8_8_;
  auVar348._6_2_ = uStack_46;
  auVar348._4_2_ = auVar4._2_2_;
  auVar348._0_2_ = auVar4._0_2_;
  auVar348._2_2_ = local_48;
  auVar89._2_2_ = uStack_40;
  auVar89._0_2_ = auVar4._8_2_;
  auVar89._4_2_ = auVar4._10_2_;
  auVar89._6_2_ = uStack_3e;
  auVar89._8_2_ = auVar4._12_2_;
  auVar89._10_2_ = uStack_3c;
  auVar89._12_2_ = auVar4._14_2_;
  auVar89._14_2_ = uStack_3a;
  auVar4 = pmaddwd(auVar348,auVar284);
  auVar312 = pmaddwd(auVar89,auVar284);
  auVar385._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar385._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar385._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar385._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar395._0_4_ = auVar312._0_4_ + 0x800 >> 0xc;
  auVar395._4_4_ = auVar312._4_4_ + 0x800 >> 0xc;
  auVar395._8_4_ = auVar312._8_4_ + 0x800 >> 0xc;
  auVar395._12_4_ = auVar312._12_4_ + 0x800 >> 0xc;
  auVar514 = packssdw(auVar385,auVar395);
  auVar4 = pmaddwd(auVar348,auVar49);
  auVar312 = pmaddwd(auVar89,auVar49);
  auVar352._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar352._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar352._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar352._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar90._0_4_ = auVar312._0_4_ + 0x800 >> 0xc;
  auVar90._4_4_ = auVar312._4_4_ + 0x800 >> 0xc;
  auVar90._8_4_ = auVar312._8_4_ + 0x800 >> 0xc;
  auVar90._12_4_ = auVar312._12_4_ + 0x800 >> 0xc;
  auVar189 = packssdw(auVar352,auVar90);
  local_1b8 = auVar430._0_2_;
  uStack_1b6 = auVar430._2_2_;
  uStack_1b4 = auVar430._4_2_;
  uStack_1b2 = auVar430._6_2_;
  uStack_1b0 = auVar430._8_2_;
  uStack_1ae = auVar430._10_2_;
  uStack_1ac = auVar430._12_2_;
  uStack_1aa = auVar430._14_2_;
  auVar411._0_12_ = auVar2._0_12_;
  auVar411._12_2_ = auVar2._6_2_;
  auVar411._14_2_ = uStack_1b2;
  auVar410._12_4_ = auVar411._12_4_;
  auVar410._0_10_ = auVar2._0_10_;
  auVar410._10_2_ = uStack_1b4;
  auVar312._10_6_ = auVar410._10_6_;
  auVar312._0_8_ = auVar2._0_8_;
  auVar312._8_2_ = auVar2._4_2_;
  auVar412._8_8_ = auVar312._8_8_;
  auVar412._6_2_ = uStack_1b6;
  auVar412._4_2_ = auVar2._2_2_;
  auVar412._0_2_ = auVar2._0_2_;
  auVar412._2_2_ = local_1b8;
  auVar172._2_2_ = uStack_1b0;
  auVar172._0_2_ = auVar2._8_2_;
  auVar172._4_2_ = auVar2._10_2_;
  auVar172._6_2_ = uStack_1ae;
  auVar172._8_2_ = auVar2._12_2_;
  auVar172._10_2_ = uStack_1ac;
  auVar172._12_2_ = auVar2._14_2_;
  auVar172._14_2_ = uStack_1aa;
  auVar312 = pmaddwd(auVar412,auVar284);
  auVar2 = pmaddwd(auVar172,auVar284);
  auVar287._0_4_ = auVar312._0_4_ + 0x800 >> 0xc;
  auVar287._4_4_ = auVar312._4_4_ + 0x800 >> 0xc;
  auVar287._8_4_ = auVar312._8_4_ + 0x800 >> 0xc;
  auVar287._12_4_ = auVar312._12_4_ + 0x800 >> 0xc;
  auVar91._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar91._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar91._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar91._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar250 = packssdw(auVar287,auVar91);
  auVar2 = pmaddwd(auVar412,auVar49);
  auVar312 = pmaddwd(auVar172,auVar49);
  auVar472._0_4_ = auVar2._0_4_ + 0x800 >> 0xc;
  auVar472._4_4_ = auVar2._4_4_ + 0x800 >> 0xc;
  auVar472._8_4_ = auVar2._8_4_ + 0x800 >> 0xc;
  auVar472._12_4_ = auVar2._12_4_ + 0x800 >> 0xc;
  auVar173._0_4_ = auVar312._0_4_ + 0x800 >> 0xc;
  auVar173._4_4_ = auVar312._4_4_ + 0x800 >> 0xc;
  auVar173._8_4_ = auVar312._8_4_ + 0x800 >> 0xc;
  auVar173._12_4_ = auVar312._12_4_ + 0x800 >> 0xc;
  auVar2 = packssdw(auVar472,auVar173);
  local_1a8 = auVar387._0_2_;
  uStack_1a6 = auVar387._2_2_;
  uStack_1a4 = auVar387._4_2_;
  uStack_1a2 = auVar387._6_2_;
  uStack_1a0 = auVar387._8_2_;
  uStack_19e = auVar387._10_2_;
  uStack_19c = auVar387._12_2_;
  uStack_19a = auVar387._14_2_;
  auVar95._0_12_ = auVar100._0_12_;
  auVar95._12_2_ = auVar100._6_2_;
  auVar95._14_2_ = uStack_1a2;
  auVar94._12_4_ = auVar95._12_4_;
  auVar94._0_10_ = auVar100._0_10_;
  auVar94._10_2_ = uStack_1a4;
  auVar93._10_6_ = auVar94._10_6_;
  auVar93._0_8_ = auVar100._0_8_;
  auVar93._8_2_ = auVar100._4_2_;
  auVar92._8_8_ = auVar93._8_8_;
  auVar92._6_2_ = uStack_1a6;
  auVar92._4_2_ = auVar100._2_2_;
  auVar92._0_2_ = auVar100._0_2_;
  auVar92._2_2_ = local_1a8;
  auVar174._2_2_ = uStack_1a0;
  auVar174._0_2_ = auVar100._8_2_;
  auVar174._4_2_ = auVar100._10_2_;
  auVar174._6_2_ = uStack_19e;
  auVar174._8_2_ = auVar100._12_2_;
  auVar174._10_2_ = uStack_19c;
  auVar174._12_2_ = auVar100._14_2_;
  auVar174._14_2_ = uStack_19a;
  auVar100 = pmaddwd(auVar92,auVar284);
  auVar5 = pmaddwd(auVar284,auVar174);
  auVar312 = pmaddwd(auVar92,auVar49);
  auVar4 = pmaddwd(auVar174,auVar49);
  auVar241._0_4_ = auVar100._0_4_ + 0x800 >> 0xc;
  auVar241._4_4_ = auVar100._4_4_ + 0x800 >> 0xc;
  auVar241._8_4_ = auVar100._8_4_ + 0x800 >> 0xc;
  auVar241._12_4_ = auVar100._12_4_ + 0x800 >> 0xc;
  auVar329._0_4_ = auVar5._0_4_ + 0x800 >> 0xc;
  auVar329._4_4_ = auVar5._4_4_ + 0x800 >> 0xc;
  auVar329._8_4_ = auVar5._8_4_ + 0x800 >> 0xc;
  auVar329._12_4_ = auVar5._12_4_ + 0x800 >> 0xc;
  auVar5 = packssdw(auVar241,auVar329);
  auVar100._0_4_ = auVar312._0_4_ + 0x800 >> 0xc;
  auVar100._4_4_ = auVar312._4_4_ + 0x800 >> 0xc;
  auVar100._8_4_ = auVar312._8_4_ + 0x800 >> 0xc;
  auVar100._12_4_ = auVar312._12_4_ + 0x800 >> 0xc;
  auVar175._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar175._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar175._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar175._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar312 = packssdw(auVar100,auVar175);
  alVar330 = (__m128i)paddsw(auVar204,auVar246);
  *output = alVar330;
  alVar330 = (__m128i)psubsw(auVar204,auVar246);
  output[0x3f] = alVar330;
  alVar330 = (__m128i)paddsw(auVar489,auVar248);
  output[1] = alVar330;
  alVar330 = (__m128i)psubsw(auVar489,auVar248);
  output[0x3e] = alVar330;
  alVar330 = (__m128i)paddsw(auVar404,auVar110);
  output[2] = alVar330;
  alVar330 = (__m128i)psubsw(auVar404,auVar110);
  output[0x3d] = alVar330;
  alVar330 = (__m128i)paddsw(auVar191,auVar179);
  output[3] = alVar330;
  alVar330 = (__m128i)psubsw(auVar191,auVar179);
  output[0x3c] = alVar330;
  alVar330 = (__m128i)paddsw(auVar193,auVar242);
  output[4] = alVar330;
  alVar330 = (__m128i)psubsw(auVar193,auVar242);
  output[0x3b] = alVar330;
  alVar330 = (__m128i)paddsw(auVar195,auVar112);
  output[5] = alVar330;
  alVar330 = (__m128i)psubsw(auVar195,auVar112);
  output[0x3a] = alVar330;
  alVar330 = (__m128i)paddsw(auVar197,auVar114);
  output[6] = alVar330;
  alVar330 = (__m128i)psubsw(auVar197,auVar114);
  output[0x39] = alVar330;
  alVar330 = (__m128i)paddsw(auVar403,auVar118);
  output[7] = alVar330;
  alVar330 = (__m128i)psubsw(auVar403,auVar118);
  output[0x38] = alVar330;
  alVar330 = (__m128i)paddsw(auVar457,auVar391);
  output[8] = alVar330;
  alVar330 = (__m128i)psubsw(auVar457,auVar391);
  output[0x37] = alVar330;
  alVar330 = (__m128i)paddsw(auVar488,auVar325);
  output[9] = alVar330;
  alVar330 = (__m128i)psubsw(auVar488,auVar325);
  output[0x36] = alVar330;
  alVar330 = (__m128i)paddsw(auVar513,auVar318);
  output[10] = alVar330;
  alVar330 = (__m128i)psubsw(auVar513,auVar318);
  output[0x35] = alVar330;
  alVar330 = (__m128i)paddsw(auVar288,auVar316);
  output[0xb] = alVar330;
  alVar330 = (__m128i)psubsw(auVar288,auVar316);
  output[0x34] = alVar330;
  alVar330 = (__m128i)paddsw(auVar314,auVar315);
  output[0xc] = alVar330;
  alVar330 = (__m128i)psubsw(auVar314,auVar315);
  output[0x33] = alVar330;
  alVar330 = (__m128i)paddsw(auVar102,auVar189);
  output[0xd] = alVar330;
  alVar330 = (__m128i)psubsw(auVar102,auVar189);
  output[0x32] = alVar330;
  alVar330 = (__m128i)paddsw(auVar335,auVar2);
  output[0xe] = alVar330;
  alVar330 = (__m128i)psubsw(auVar335,auVar2);
  output[0x31] = alVar330;
  alVar330 = (__m128i)paddsw(auVar354,auVar312);
  output[0xf] = alVar330;
  alVar330 = (__m128i)psubsw(auVar354,auVar312);
  output[0x30] = alVar330;
  alVar330 = (__m128i)paddsw(auVar97,auVar5);
  output[0x10] = alVar330;
  alVar330 = (__m128i)psubsw(auVar97,auVar5);
  output[0x2f] = alVar330;
  alVar330 = (__m128i)paddsw(auVar7,auVar250);
  output[0x11] = alVar330;
  alVar330 = (__m128i)psubsw(auVar7,auVar250);
  output[0x2e] = alVar330;
  alVar330 = (__m128i)paddsw(auVar98,auVar514);
  output[0x12] = alVar330;
  alVar330 = (__m128i)psubsw(auVar98,auVar514);
  output[0x2d] = alVar330;
  alVar330 = (__m128i)paddsw(auVar96,auVar317);
  output[0x13] = alVar330;
  alVar330 = (__m128i)psubsw(auVar96,auVar317);
  output[0x2c] = alVar330;
  alVar330 = (__m128i)paddsw(auVar185,auVar334);
  output[0x14] = alVar330;
  alVar330 = (__m128i)psubsw(auVar185,auVar334);
  output[0x2b] = alVar330;
  alVar330 = (__m128i)paddsw(auVar6,auVar372);
  output[0x15] = alVar330;
  alVar330 = (__m128i)psubsw(auVar6,auVar372);
  output[0x2a] = alVar330;
  alVar330 = (__m128i)paddsw(auVar108,auVar244);
  output[0x16] = alVar330;
  alVar330 = (__m128i)psubsw(auVar108,auVar244);
  output[0x29] = alVar330;
  alVar330 = (__m128i)paddsw(auVar106,auVar373);
  output[0x17] = alVar330;
  alVar330 = (__m128i)psubsw(auVar106,auVar373);
  output[0x28] = alVar330;
  alVar330 = (__m128i)paddsw(auVar332,auVar116);
  output[0x18] = alVar330;
  alVar330 = (__m128i)psubsw(auVar332,auVar116);
  output[0x27] = alVar330;
  alVar330 = (__m128i)paddsw(auVar122,auVar124);
  output[0x19] = alVar330;
  alVar330 = (__m128i)psubsw(auVar122,auVar124);
  output[0x26] = alVar330;
  alVar330 = (__m128i)paddsw(auVar252,auVar187);
  output[0x1a] = alVar330;
  alVar330 = (__m128i)psubsw(auVar252,auVar187);
  output[0x25] = alVar330;
  alVar330 = (__m128i)paddsw(auVar120,auVar3);
  output[0x1b] = alVar330;
  alVar330 = (__m128i)psubsw(auVar120,auVar3);
  output[0x24] = alVar330;
  alVar330 = (__m128i)paddsw(auVar183,auVar389);
  output[0x1c] = alVar330;
  alVar330 = (__m128i)psubsw(auVar183,auVar389);
  output[0x23] = alVar330;
  alVar330 = (__m128i)paddsw(auVar181,auVar198);
  output[0x1d] = alVar330;
  alVar330 = (__m128i)psubsw(auVar181,auVar198);
  output[0x22] = alVar330;
  alVar330 = (__m128i)paddsw(auVar177,auVar388);
  output[0x1e] = alVar330;
  alVar330 = (__m128i)psubsw(auVar177,auVar388);
  output[0x21] = alVar330;
  alVar330 = (__m128i)paddsw(auVar104,auVar458);
  output[0x1f] = alVar330;
  alVar330 = (__m128i)psubsw(auVar104,auVar458);
  output[0x20] = alVar330;
  return;
}

Assistant:

static void idct64_low32_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[64];
  x[0] = input[0];
  x[2] = input[16];
  x[4] = input[8];
  x[6] = input[24];
  x[8] = input[4];
  x[10] = input[20];
  x[12] = input[12];
  x[14] = input[28];
  x[16] = input[2];
  x[18] = input[18];
  x[20] = input[10];
  x[22] = input[26];
  x[24] = input[6];
  x[26] = input[22];
  x[28] = input[14];
  x[30] = input[30];
  x[32] = input[1];
  x[34] = input[17];
  x[36] = input[9];
  x[38] = input[25];
  x[40] = input[5];
  x[42] = input[21];
  x[44] = input[13];
  x[46] = input[29];
  x[48] = input[3];
  x[50] = input[19];
  x[52] = input[11];
  x[54] = input[27];
  x[56] = input[7];
  x[58] = input[23];
  x[60] = input[15];
  x[62] = input[31];

  // stage 2
  btf_16_ssse3(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_ssse3(-cospi[33], cospi[31], x[62], x[33], x[62]);
  btf_16_ssse3(cospi[47], cospi[17], x[34], x[34], x[61]);
  btf_16_ssse3(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_ssse3(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_ssse3(-cospi[41], cospi[23], x[58], x[37], x[58]);
  btf_16_ssse3(cospi[39], cospi[25], x[38], x[38], x[57]);
  btf_16_ssse3(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_ssse3(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_ssse3(-cospi[37], cospi[27], x[54], x[41], x[54]);
  btf_16_ssse3(cospi[43], cospi[21], x[42], x[42], x[53]);
  btf_16_ssse3(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_ssse3(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_ssse3(-cospi[45], cospi[19], x[50], x[45], x[50]);
  btf_16_ssse3(cospi[35], cospi[29], x[46], x[46], x[49]);
  btf_16_ssse3(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[34], cospi[30], x[30], x[17], x[30]);
  btf_16_ssse3(cospi[46], cospi[18], x[18], x[18], x[29]);
  btf_16_ssse3(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_ssse3(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_ssse3(-cospi[42], cospi[22], x[26], x[21], x[26]);
  btf_16_ssse3(cospi[38], cospi[26], x[22], x[22], x[25]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);
  btf_16_adds_subs_sse2(x[32], x[33]);
  btf_16_subs_adds_sse2(x[35], x[34]);
  btf_16_adds_subs_sse2(x[36], x[37]);
  btf_16_subs_adds_sse2(x[39], x[38]);
  btf_16_adds_subs_sse2(x[40], x[41]);
  btf_16_subs_adds_sse2(x[43], x[42]);
  btf_16_adds_subs_sse2(x[44], x[45]);
  btf_16_subs_adds_sse2(x[47], x[46]);
  btf_16_adds_subs_sse2(x[48], x[49]);
  btf_16_subs_adds_sse2(x[51], x[50]);
  btf_16_adds_subs_sse2(x[52], x[53]);
  btf_16_subs_adds_sse2(x[55], x[54]);
  btf_16_adds_subs_sse2(x[56], x[57]);
  btf_16_subs_adds_sse2(x[59], x[58]);
  btf_16_adds_subs_sse2(x[60], x[61]);
  btf_16_subs_adds_sse2(x[63], x[62]);

  // stage 4
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_ssse3(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);
  btf_16_adds_subs_sse2(x[16], x[17]);
  btf_16_subs_adds_sse2(x[19], x[18]);
  btf_16_adds_subs_sse2(x[20], x[21]);
  btf_16_subs_adds_sse2(x[23], x[22]);
  btf_16_adds_subs_sse2(x[24], x[25]);
  btf_16_subs_adds_sse2(x[27], x[26]);
  btf_16_adds_subs_sse2(x[28], x[29]);
  btf_16_subs_adds_sse2(x[31], x[30]);
  idct64_stage4_high32_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_ssse3(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);
  idct64_stage5_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 6
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_ssse3(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);
  idct64_stage6_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 7
  btf_16_adds_subs_sse2(x[0], x[3]);
  btf_16_adds_subs_sse2(x[1], x[2]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);
  idct64_stage7_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 8
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
  idct64_stage8_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 9~11
  idct64_stage9_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage10_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage11_sse2(output, x);
}